

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::aggregateVars(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *row,int *i)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  DataKey *pDVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  oldlower;
  shared_ptr<soplex::Tolerances> tols;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  bool bVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  type_conflict5 tVar15;
  uint uVar16;
  double *pdVar17;
  multiprecision *pmVar18;
  uint *puVar19;
  AggregationPS *this_00;
  SPxInternalCodeException *pSVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar25;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar26;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  Item *pIVar29;
  uint *puVar30;
  pointer pnVar31;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar32;
  multiprecision *pmVar33;
  soplex *psVar34;
  long lVar35;
  int r;
  shared_ptr<soplex::Tolerances> *psVar36;
  long lVar37;
  Item *pIVar38;
  byte bVar39;
  Real RVar40;
  undefined1 in_stack_ffffffffffffdfb8 [15];
  undefined1 uVar41;
  uint uVar42;
  uint i_00;
  uint uVar43;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *lp_00;
  undefined3 in_stack_ffffffffffffdfd8;
  undefined4 uVar44;
  uint uVar45;
  int iVar46;
  undefined4 uVar47;
  undefined4 in_stack_ffffffffffffdfe4;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar48;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  int iVar49;
  int32_t iVar50;
  Item *pIVar51;
  undefined4 uVar52;
  fpclass_type fVar53;
  Item *pIVar54;
  undefined4 uVar55;
  int32_t iVar56;
  fpclass_type fVar57;
  int iVar58;
  int32_t iVar59;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aggr_const;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1dc8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_35;
  cpp_dec_float<200U,_int,_void> local_1d38;
  cpp_dec_float<200U,_int,_void> local_1cb8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj_j;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1ab8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_19b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1938;
  cpp_dec_float<200U,_int,_void> local_18b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_34;
  cpp_dec_float<200U,_int,_void> local_17b8;
  cpp_dec_float<200U,_int,_void> local_1738;
  cpp_dec_float<200U,_int,_void> local_16b8;
  cpp_dec_float<200U,_int,_void> local_1638;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_14b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_12b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_11b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1038;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fb8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_32;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_31;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_28;
  uint local_db0 [28];
  int local_d40;
  undefined1 local_d3c;
  fpclass_type local_d38;
  int32_t local_d34;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_cb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  soplex local_730 [112];
  int local_6c0;
  undefined1 local_6bc;
  fpclass_type local_6b8;
  int32_t iStack_6b4;
  soplex local_6b0 [112];
  int local_640;
  undefined1 local_63c;
  fpclass_type local_638;
  int32_t iStack_634;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  multiprecision local_530 [116];
  multiprecision amStack_4bc [124];
  int local_440;
  multiprecision local_43c;
  fpclass_type local_438;
  int32_t iStack_434;
  multiprecision local_430 [128];
  multiprecision local_3b0 [112];
  int local_340;
  multiprecision local_33c;
  fpclass_type local_338;
  int32_t iStack_334;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t local_34;
  
  bVar39 = 0;
  iVar46 = *i;
  pnVar5 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar22 = 0x1c;
  puVar30 = (uint *)(pnVar5 + iVar46);
  pcVar27 = &local_18b8;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    (pcVar27->data)._M_elems[0] = *puVar30;
    puVar30 = puVar30 + 1;
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  local_18b8.exp = pnVar5[iVar46].m_backend.exp;
  local_18b8.neg = pnVar5[iVar46].m_backend.neg;
  local_18b8.fpclass = pnVar5[iVar46].m_backend.fpclass;
  local_18b8.prec_elem = pnVar5[iVar46].m_backend.prec_elem;
  pNVar6 = row->m_elem;
  i_00 = pNVar6->idx;
  uVar42 = pNVar6[1].idx;
  pNVar32 = pNVar6;
  pcVar27 = &local_1cb8;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    (pcVar27->data)._M_elems[0] = (pNVar32->val).m_backend.data._M_elems[0];
    pNVar32 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pNVar32->val).m_backend.data._M_elems + 1);
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  local_1cb8.exp = (pNVar6->val).m_backend.exp;
  local_1cb8.neg = (pNVar6->val).m_backend.neg;
  local_1cb8.fpclass = (pNVar6->val).m_backend.fpclass;
  local_1cb8.prec_elem = (pNVar6->val).m_backend.prec_elem;
  pNVar32 = pNVar6 + 1;
  pcVar27 = &local_1d38;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    (pcVar27->data)._M_elems[0] = (pNVar32->val).m_backend.data._M_elems[0];
    pNVar32 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pNVar32->val).m_backend.data._M_elems + 1);
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  local_1d38.exp = pNVar6[1].val.m_backend.exp;
  local_1d38.neg = pNVar6[1].val.m_backend.neg;
  local_1d38.fpclass = pNVar6[1].val.m_backend.fpclass;
  local_1d38.prec_elem = pNVar6[1].val.m_backend.prec_elem;
  lVar35 = (long)(int)i_00;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar30 = (uint *)(pnVar5 + lVar35);
  pcVar27 = &local_16b8;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    (pcVar27->data)._M_elems[0] = *puVar30;
    puVar30 = puVar30 + 1;
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  iVar46 = pnVar5[lVar35].m_backend.exp;
  local_16b8.exp = iVar46;
  local_3c = pnVar5[lVar35].m_backend.neg;
  local_16b8.neg = (bool)local_3c;
  local_38 = pnVar5[lVar35].m_backend.fpclass;
  local_34 = pnVar5[lVar35].m_backend.prec_elem;
  local_16b8.prec_elem = local_34;
  local_16b8.fpclass = local_38;
  pnVar31 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar30 = (uint *)(pnVar31 + lVar35);
  pcVar27 = &local_1738;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    (pcVar27->data)._M_elems[0] = *puVar30;
    puVar30 = puVar30 + 1;
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  local_c0 = pnVar31[lVar35].m_backend.exp;
  local_1738.exp = local_c0;
  local_bc = pnVar31[lVar35].m_backend.neg;
  local_1738.neg = (bool)local_bc;
  local_b8 = pnVar31[lVar35].m_backend.fpclass;
  local_b4 = pnVar31[lVar35].m_backend.prec_elem;
  local_1738.prec_elem = local_b4;
  local_1738.fpclass = local_b8;
  lVar37 = (long)(int)uVar42;
  puVar30 = (uint *)(pnVar5 + lVar37);
  pcVar27 = &local_1638;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    (pcVar27->data)._M_elems[0] = *puVar30;
    puVar30 = puVar30 + 1;
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  iVar49 = pnVar5[lVar37].m_backend.exp;
  local_1638.exp = iVar49;
  uVar41 = pnVar5[lVar37].m_backend.neg;
  local_1638.neg = (bool)uVar41;
  fVar53 = pnVar5[lVar37].m_backend.fpclass;
  iVar59 = pnVar5[lVar37].m_backend.prec_elem;
  local_1638.prec_elem = iVar59;
  local_1638.fpclass = fVar53;
  puVar30 = (uint *)(pnVar31 + lVar37);
  pcVar27 = &local_17b8;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    (pcVar27->data)._M_elems[0] = *puVar30;
    puVar30 = puVar30 + 1;
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  iVar58 = pnVar31[lVar37].m_backend.exp;
  local_17b8.exp = iVar58;
  local_17b8.neg = pnVar31[lVar37].m_backend.neg;
  uVar44 = CONCAT13(local_17b8.neg,in_stack_ffffffffffffdfd8);
  fVar57 = pnVar31[lVar37].m_backend.fpclass;
  iVar56 = pnVar31[lVar37].m_backend.prec_elem;
  local_17b8.prec_elem = iVar56;
  local_17b8.fpclass = fVar57;
  pcVar27 = &local_16b8;
  puVar30 = local_b0;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    *puVar30 = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
    puVar30 = puVar30 + 1;
  }
  pcVar27 = &local_1738;
  puVar30 = local_130;
  local_40 = iVar46;
  for (; lVar22 != 0; lVar22 = lVar22 + -1) {
    *puVar30 = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
    puVar30 = puVar30 + 1;
  }
  pSVar48 = this;
  feastol(&local_1b0,this);
  bVar14 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_b0,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_130,&local_1b0);
  if (bVar14) {
    return OKAY;
  }
  lVar22 = 0x1c;
  pcVar27 = &local_1638;
  pnVar26 = &local_230;
  for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  pcVar27 = &local_17b8;
  pnVar26 = &local_2b0;
  local_230.m_backend.exp = iVar49;
  local_230.m_backend.neg = (bool)uVar41;
  local_230.m_backend.fpclass = fVar53;
  local_230.m_backend.prec_elem = iVar59;
  for (; lVar22 != 0; lVar22 = lVar22 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_2b0.m_backend.neg = SUB41((uint)uVar44 >> 0x18,0);
  local_2b0.m_backend.exp = iVar58;
  local_2b0.m_backend.fpclass = fVar57;
  local_2b0.m_backend.prec_elem = iVar56;
  feastol(&local_330,this);
  bVar14 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_230,&local_2b0,&local_330);
  if (bVar14) {
    return OKAY;
  }
  local_1938.m_backend.fpclass = cpp_dec_float_finite;
  local_1938.m_backend.prec_elem = 0x1c;
  local_1938.m_backend.data._M_elems[0] = 0;
  local_1938.m_backend.data._M_elems[1] = 0;
  local_1938.m_backend.data._M_elems[2] = 0;
  local_1938.m_backend.data._M_elems[3] = 0;
  local_1938.m_backend.data._M_elems[4] = 0;
  local_1938.m_backend.data._M_elems[5] = 0;
  local_1938.m_backend.data._M_elems[6] = 0;
  local_1938.m_backend.data._M_elems[7] = 0;
  local_1938.m_backend.data._M_elems[8] = 0;
  local_1938.m_backend.data._M_elems[9] = 0;
  local_1938.m_backend.data._M_elems[10] = 0;
  local_1938.m_backend.data._M_elems[0xb] = 0;
  local_1938.m_backend.data._M_elems[0xc] = 0;
  local_1938.m_backend.data._M_elems[0xd] = 0;
  local_1938.m_backend.data._M_elems[0xe] = 0;
  local_1938.m_backend.data._M_elems[0xf] = 0;
  local_1938.m_backend.data._M_elems[0x10] = 0;
  local_1938.m_backend.data._M_elems[0x11] = 0;
  local_1938.m_backend.data._M_elems[0x12] = 0;
  local_1938.m_backend.data._M_elems[0x13] = 0;
  local_1938.m_backend.data._M_elems[0x14] = 0;
  local_1938.m_backend.data._M_elems[0x15] = 0;
  local_1938.m_backend.data._M_elems[0x16] = 0;
  local_1938.m_backend.data._M_elems[0x17] = 0;
  local_1938.m_backend.data._M_elems[0x18] = 0;
  local_1938.m_backend.data._M_elems[0x19] = 0;
  local_1938.m_backend.data._M_elems._104_5_ = 0;
  local_1938.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_1938.m_backend.exp = 0;
  local_1938.m_backend.neg = false;
  local_19b8.m_backend.fpclass = cpp_dec_float_finite;
  local_19b8.m_backend.prec_elem = 0x1c;
  local_19b8.m_backend.data._M_elems[0] = 0;
  local_19b8.m_backend.data._M_elems[1] = 0;
  local_19b8.m_backend.data._M_elems[2] = 0;
  local_19b8.m_backend.data._M_elems[3] = 0;
  local_19b8.m_backend.data._M_elems[4] = 0;
  local_19b8.m_backend.data._M_elems[5] = 0;
  local_19b8.m_backend.data._M_elems[6] = 0;
  local_19b8.m_backend.data._M_elems[7] = 0;
  local_19b8.m_backend.data._M_elems[8] = 0;
  local_19b8.m_backend.data._M_elems[9] = 0;
  local_19b8.m_backend.data._M_elems[10] = 0;
  local_19b8.m_backend.data._M_elems[0xb] = 0;
  local_19b8.m_backend.data._M_elems[0xc] = 0;
  local_19b8.m_backend.data._M_elems[0xd] = 0;
  local_19b8.m_backend.data._M_elems[0xe] = 0;
  local_19b8.m_backend.data._M_elems[0xf] = 0;
  local_19b8.m_backend.data._M_elems[0x18] = 0;
  local_19b8.m_backend.data._M_elems[0x19] = 0;
  local_19b8.m_backend.data._M_elems._104_5_ = 0;
  local_19b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_19b8.m_backend.exp = 0;
  local_19b8.m_backend.neg = false;
  local_19b8.m_backend.data._M_elems[0x10] = 0;
  local_19b8.m_backend.data._M_elems[0x11] = 0;
  local_19b8.m_backend.data._M_elems[0x12] = 0;
  local_19b8.m_backend.data._M_elems[0x13] = 0;
  local_19b8.m_backend.data._M_elems[0x14] = 0;
  local_19b8.m_backend.data._M_elems[0x15] = 0;
  local_19b8.m_backend.data._M_elems[0x16] = 0;
  local_19b8.m_backend.data._M_elems[0x17] = 0;
  local_1ab8.m_backend.fpclass = cpp_dec_float_finite;
  local_1ab8.m_backend.prec_elem = 0x1c;
  local_1ab8.m_backend.data._M_elems[0] = 0;
  local_1ab8.m_backend.data._M_elems[1] = 0;
  local_1ab8.m_backend.data._M_elems[2] = 0;
  local_1ab8.m_backend.data._M_elems[3] = 0;
  local_1ab8.m_backend.data._M_elems[4] = 0;
  local_1ab8.m_backend.data._M_elems[5] = 0;
  local_1ab8.m_backend.data._M_elems[6] = 0;
  local_1ab8.m_backend.data._M_elems[7] = 0;
  local_1ab8.m_backend.data._M_elems[8] = 0;
  local_1ab8.m_backend.data._M_elems[9] = 0;
  local_1ab8.m_backend.data._M_elems[10] = 0;
  local_1ab8.m_backend.data._M_elems[0xb] = 0;
  local_1ab8.m_backend.data._M_elems[0xc] = 0;
  local_1ab8.m_backend.data._M_elems[0xd] = 0;
  local_1ab8.m_backend.data._M_elems[0xe] = 0;
  local_1ab8.m_backend.data._M_elems[0xf] = 0;
  local_1ab8.m_backend.data._M_elems[0x10] = 0;
  local_1ab8.m_backend.data._M_elems[0x11] = 0;
  local_1ab8.m_backend.data._M_elems[0x12] = 0;
  local_1ab8.m_backend.data._M_elems[0x13] = 0;
  local_1ab8.m_backend.data._M_elems[0x18] = 0;
  local_1ab8.m_backend.data._M_elems[0x19] = 0;
  local_1ab8.m_backend.data._M_elems._104_5_ = 0;
  local_1ab8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_1ab8.m_backend.exp = 0;
  local_1ab8.m_backend.neg = false;
  local_1ab8.m_backend.data._M_elems[0x14] = 0;
  local_1ab8.m_backend.data._M_elems[0x15] = 0;
  local_1ab8.m_backend.data._M_elems[0x16] = 0;
  local_1ab8.m_backend.data._M_elems[0x17] = 0;
  local_1b38.m_backend.fpclass = cpp_dec_float_finite;
  local_1b38.m_backend.prec_elem = 0x1c;
  local_1b38.m_backend.data._M_elems[0] = 0;
  local_1b38.m_backend.data._M_elems[1] = 0;
  local_1b38.m_backend.data._M_elems[2] = 0;
  local_1b38.m_backend.data._M_elems[3] = 0;
  local_1b38.m_backend.data._M_elems[4] = 0;
  local_1b38.m_backend.data._M_elems[5] = 0;
  local_1b38.m_backend.data._M_elems[6] = 0;
  local_1b38.m_backend.data._M_elems[7] = 0;
  local_1b38.m_backend.data._M_elems[8] = 0;
  local_1b38.m_backend.data._M_elems[9] = 0;
  local_1b38.m_backend.data._M_elems[10] = 0;
  local_1b38.m_backend.data._M_elems[0xb] = 0;
  local_1b38.m_backend.data._M_elems[0xc] = 0;
  local_1b38.m_backend.data._M_elems[0xd] = 0;
  local_1b38.m_backend.data._M_elems[0xe] = 0;
  local_1b38.m_backend.data._M_elems[0xf] = 0;
  local_1b38.m_backend.data._M_elems[0x10] = 0;
  local_1b38.m_backend.data._M_elems[0x11] = 0;
  local_1b38.m_backend.data._M_elems[0x12] = 0;
  local_1b38.m_backend.data._M_elems[0x13] = 0;
  local_1b38.m_backend.data._M_elems[0x14] = 0;
  local_1b38.m_backend.data._M_elems[0x15] = 0;
  local_1b38.m_backend.data._M_elems[0x16] = 0;
  local_1b38.m_backend.data._M_elems[0x17] = 0;
  local_1b38.m_backend.data._M_elems[0x18] = 0;
  local_1b38.m_backend.data._M_elems[0x19] = 0;
  local_1b38.m_backend.data._M_elems._104_5_ = 0;
  local_1b38.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_1b38.m_backend.exp = 0;
  local_1b38.m_backend.neg = false;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&local_1cb8,&local_1d38);
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  tVar15 = boost::multiprecision::operator<
                     ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result.m_backend,(double *)&aggr_const);
  if (tVar15) {
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_17b8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar17,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 0x1c;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems[6] = 0;
      scale1.m_backend.data._M_elems[7] = 0;
      scale1.m_backend.data._M_elems[8] = 0;
      scale1.m_backend.data._M_elems[9] = 0;
      scale1.m_backend.data._M_elems[10] = 0;
      scale1.m_backend.data._M_elems[0xb] = 0;
      scale1.m_backend.data._M_elems[0xc] = 0;
      scale1.m_backend.data._M_elems[0xd] = 0;
      scale1.m_backend.data._M_elems[0xe] = 0;
      scale1.m_backend.data._M_elems[0xf] = 0;
      scale1.m_backend.data._M_elems[0x10] = 0;
      scale1.m_backend.data._M_elems[0x11] = 0;
      scale1.m_backend.data._M_elems[0x12] = 0;
      scale1.m_backend.data._M_elems[0x13] = 0;
      scale1.m_backend.data._M_elems[0x14] = 0;
      scale1.m_backend.data._M_elems[0x15] = 0;
      scale1.m_backend.data._M_elems[0x16] = 0;
      scale1.m_backend.data._M_elems[0x17] = 0;
      scale1.m_backend.data._M_elems[0x18] = 0;
      scale1.m_backend.data._M_elems[0x19] = 0;
      scale1.m_backend.data._M_elems._104_5_ = 0;
      scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&scale1.m_backend,&local_1d38,&local_17b8);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems[6] = 0;
      obj_j.m_backend.data._M_elems[7] = 0;
      obj_j.m_backend.data._M_elems[8] = 0;
      obj_j.m_backend.data._M_elems[9] = 0;
      obj_j.m_backend.data._M_elems[10] = 0;
      obj_j.m_backend.data._M_elems[0xb] = 0;
      obj_j.m_backend.data._M_elems[0xc] = 0;
      obj_j.m_backend.data._M_elems[0xd] = 0;
      obj_j.m_backend.data._M_elems[0xe] = 0;
      obj_j.m_backend.data._M_elems[0xf] = 0;
      obj_j.m_backend.data._M_elems[0x10] = 0;
      obj_j.m_backend.data._M_elems[0x11] = 0;
      obj_j.m_backend.data._M_elems[0x12] = 0;
      obj_j.m_backend.data._M_elems[0x13] = 0;
      obj_j.m_backend.data._M_elems[0x14] = 0;
      obj_j.m_backend.data._M_elems[0x15] = 0;
      obj_j.m_backend.data._M_elems[0x16] = 0;
      obj_j.m_backend.data._M_elems[0x17] = 0;
      obj_j.m_backend.data._M_elems[0x18] = 0;
      obj_j.m_backend.data._M_elems[0x19] = 0;
      obj_j.m_backend.data._M_elems._104_5_ = 0;
      obj_j.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&obj_j.m_backend,&local_18b8,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_1cb8);
    }
    pnVar26 = &result;
    pnVar25 = &local_1938;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1938.m_backend.exp = result.m_backend.exp;
    local_1938.m_backend.neg = result.m_backend.neg;
    local_1938.m_backend.fpclass = result.m_backend.fpclass;
    local_1938.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,-*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1638,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar17,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 0x1c;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems[6] = 0;
      scale1.m_backend.data._M_elems[7] = 0;
      scale1.m_backend.data._M_elems[8] = 0;
      scale1.m_backend.data._M_elems[9] = 0;
      scale1.m_backend.data._M_elems[10] = 0;
      scale1.m_backend.data._M_elems[0xb] = 0;
      scale1.m_backend.data._M_elems[0xc] = 0;
      scale1.m_backend.data._M_elems[0xd] = 0;
      scale1.m_backend.data._M_elems[0xe] = 0;
      scale1.m_backend.data._M_elems[0xf] = 0;
      scale1.m_backend.data._M_elems[0x10] = 0;
      scale1.m_backend.data._M_elems[0x11] = 0;
      scale1.m_backend.data._M_elems[0x12] = 0;
      scale1.m_backend.data._M_elems[0x13] = 0;
      scale1.m_backend.data._M_elems[0x14] = 0;
      scale1.m_backend.data._M_elems[0x15] = 0;
      scale1.m_backend.data._M_elems[0x16] = 0;
      scale1.m_backend.data._M_elems[0x17] = 0;
      scale1.m_backend.data._M_elems[0x18] = 0;
      scale1.m_backend.data._M_elems[0x19] = 0;
      scale1.m_backend.data._M_elems._104_5_ = 0;
      scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&scale1.m_backend,&local_1d38,&local_1638);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems[6] = 0;
      obj_j.m_backend.data._M_elems[7] = 0;
      obj_j.m_backend.data._M_elems[8] = 0;
      obj_j.m_backend.data._M_elems[9] = 0;
      obj_j.m_backend.data._M_elems[10] = 0;
      obj_j.m_backend.data._M_elems[0xb] = 0;
      obj_j.m_backend.data._M_elems[0xc] = 0;
      obj_j.m_backend.data._M_elems[0xd] = 0;
      obj_j.m_backend.data._M_elems[0xe] = 0;
      obj_j.m_backend.data._M_elems[0xf] = 0;
      obj_j.m_backend.data._M_elems[0x10] = 0;
      obj_j.m_backend.data._M_elems[0x11] = 0;
      obj_j.m_backend.data._M_elems[0x12] = 0;
      obj_j.m_backend.data._M_elems[0x13] = 0;
      obj_j.m_backend.data._M_elems[0x14] = 0;
      obj_j.m_backend.data._M_elems[0x15] = 0;
      obj_j.m_backend.data._M_elems[0x16] = 0;
      obj_j.m_backend.data._M_elems[0x17] = 0;
      obj_j.m_backend.data._M_elems[0x18] = 0;
      obj_j.m_backend.data._M_elems[0x19] = 0;
      obj_j.m_backend.data._M_elems._104_5_ = 0;
      obj_j.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&obj_j.m_backend,&local_18b8,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_1cb8);
    }
    pnVar26 = &result;
    pnVar25 = &local_19b8;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_19b8.m_backend.exp = result.m_backend.exp;
    local_19b8.m_backend.neg = result.m_backend.neg;
    local_19b8.m_backend.fpclass = result.m_backend.fpclass;
    local_19b8.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1738,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar17,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 0x1c;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems[6] = 0;
      scale1.m_backend.data._M_elems[7] = 0;
      scale1.m_backend.data._M_elems[8] = 0;
      scale1.m_backend.data._M_elems[9] = 0;
      scale1.m_backend.data._M_elems[10] = 0;
      scale1.m_backend.data._M_elems[0xb] = 0;
      scale1.m_backend.data._M_elems[0xc] = 0;
      scale1.m_backend.data._M_elems[0xd] = 0;
      scale1.m_backend.data._M_elems[0xe] = 0;
      scale1.m_backend.data._M_elems[0xf] = 0;
      scale1.m_backend.data._M_elems[0x10] = 0;
      scale1.m_backend.data._M_elems[0x11] = 0;
      scale1.m_backend.data._M_elems[0x12] = 0;
      scale1.m_backend.data._M_elems[0x13] = 0;
      scale1.m_backend.data._M_elems[0x14] = 0;
      scale1.m_backend.data._M_elems[0x15] = 0;
      scale1.m_backend.data._M_elems[0x16] = 0;
      scale1.m_backend.data._M_elems[0x17] = 0;
      scale1.m_backend.data._M_elems[0x18] = 0;
      scale1.m_backend.data._M_elems[0x19] = 0;
      scale1.m_backend.data._M_elems._104_5_ = 0;
      scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&scale1.m_backend,&local_1cb8,&local_1738);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems[6] = 0;
      obj_j.m_backend.data._M_elems[7] = 0;
      obj_j.m_backend.data._M_elems[8] = 0;
      obj_j.m_backend.data._M_elems[9] = 0;
      obj_j.m_backend.data._M_elems[10] = 0;
      obj_j.m_backend.data._M_elems[0xb] = 0;
      obj_j.m_backend.data._M_elems[0xc] = 0;
      obj_j.m_backend.data._M_elems[0xd] = 0;
      obj_j.m_backend.data._M_elems[0xe] = 0;
      obj_j.m_backend.data._M_elems[0xf] = 0;
      obj_j.m_backend.data._M_elems[0x10] = 0;
      obj_j.m_backend.data._M_elems[0x11] = 0;
      obj_j.m_backend.data._M_elems[0x12] = 0;
      obj_j.m_backend.data._M_elems[0x13] = 0;
      obj_j.m_backend.data._M_elems[0x14] = 0;
      obj_j.m_backend.data._M_elems[0x15] = 0;
      obj_j.m_backend.data._M_elems[0x16] = 0;
      obj_j.m_backend.data._M_elems[0x17] = 0;
      obj_j.m_backend.data._M_elems[0x18] = 0;
      obj_j.m_backend.data._M_elems[0x19] = 0;
      obj_j.m_backend.data._M_elems._104_5_ = 0;
      obj_j.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&obj_j.m_backend,&local_18b8,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_1d38);
    }
    pnVar26 = &result;
    pnVar25 = &local_1ab8;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1ab8.m_backend.exp = result.m_backend.exp;
    local_1ab8.m_backend.neg = result.m_backend.neg;
    local_1ab8.m_backend.fpclass = result.m_backend.fpclass;
    local_1ab8.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,-*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_16b8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar15) goto LAB_0041783a;
    pcVar27 = &local_16b8;
LAB_00417893:
    scale1.m_backend.fpclass = cpp_dec_float_finite;
    scale1.m_backend.prec_elem = 0x1c;
    scale1.m_backend.neg = false;
    scale1.m_backend.exp = 0;
    scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    scale1.m_backend.data._M_elems._104_5_ = 0;
    scale1.m_backend.data._M_elems[0x18] = 0;
    scale1.m_backend.data._M_elems[0x19] = 0;
    scale1.m_backend.data._M_elems[0x16] = 0;
    scale1.m_backend.data._M_elems[0x17] = 0;
    scale1.m_backend.data._M_elems[0x14] = 0;
    scale1.m_backend.data._M_elems[0x15] = 0;
    scale1.m_backend.data._M_elems[0x12] = 0;
    scale1.m_backend.data._M_elems[0x13] = 0;
    scale1.m_backend.data._M_elems[0x10] = 0;
    scale1.m_backend.data._M_elems[0x11] = 0;
    scale1.m_backend.data._M_elems[0xe] = 0;
    scale1.m_backend.data._M_elems[0xf] = 0;
    scale1.m_backend.data._M_elems[0xc] = 0;
    scale1.m_backend.data._M_elems[0xd] = 0;
    scale1.m_backend.data._M_elems[10] = 0;
    scale1.m_backend.data._M_elems[0xb] = 0;
    scale1.m_backend.data._M_elems[8] = 0;
    scale1.m_backend.data._M_elems[9] = 0;
    scale1.m_backend.data._M_elems[6] = 0;
    scale1.m_backend.data._M_elems[7] = 0;
    scale1.m_backend.data._M_elems[4] = 0;
    scale1.m_backend.data._M_elems[5] = 0;
    scale1.m_backend.data._M_elems[2] = 0;
    scale1.m_backend.data._M_elems[3] = 0;
    scale1.m_backend.data._M_elems[0] = 0;
    scale1.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&scale1.m_backend,&local_1cb8,pcVar27);
    obj_j.m_backend.fpclass = cpp_dec_float_finite;
    obj_j.m_backend.prec_elem = 0x1c;
    obj_j.m_backend.data._M_elems[0] = 0;
    obj_j.m_backend.data._M_elems[1] = 0;
    obj_j.m_backend.data._M_elems[2] = 0;
    obj_j.m_backend.data._M_elems[3] = 0;
    obj_j.m_backend.data._M_elems[4] = 0;
    obj_j.m_backend.data._M_elems[5] = 0;
    obj_j.m_backend.data._M_elems[6] = 0;
    obj_j.m_backend.data._M_elems[7] = 0;
    obj_j.m_backend.data._M_elems[8] = 0;
    obj_j.m_backend.data._M_elems[9] = 0;
    obj_j.m_backend.data._M_elems[10] = 0;
    obj_j.m_backend.data._M_elems[0xb] = 0;
    obj_j.m_backend.data._M_elems[0xc] = 0;
    obj_j.m_backend.data._M_elems[0xd] = 0;
    obj_j.m_backend.data._M_elems[0xe] = 0;
    obj_j.m_backend.data._M_elems[0xf] = 0;
    obj_j.m_backend.data._M_elems[0x10] = 0;
    obj_j.m_backend.data._M_elems[0x11] = 0;
    obj_j.m_backend.data._M_elems[0x12] = 0;
    obj_j.m_backend.data._M_elems[0x13] = 0;
    obj_j.m_backend.data._M_elems[0x14] = 0;
    obj_j.m_backend.data._M_elems[0x15] = 0;
    obj_j.m_backend.data._M_elems[0x16] = 0;
    obj_j.m_backend.data._M_elems[0x17] = 0;
    obj_j.m_backend.data._M_elems[0x18] = 0;
    obj_j.m_backend.data._M_elems[0x19] = 0;
    obj_j.m_backend.data._M_elems._104_5_ = 0;
    obj_j.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    obj_j.m_backend.exp = 0;
    obj_j.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&obj_j.m_backend,&local_18b8,&scale1.m_backend);
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,&obj_j.m_backend,&local_1d38);
  }
  else {
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,&local_1cb8,&local_1d38);
    aggr_const.m_backend.data._M_elems[0] = 0;
    aggr_const.m_backend.data._M_elems[1] = 0;
    tVar15 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result.m_backend,(double *)&aggr_const);
    if (!tVar15) {
      pSVar20 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XMAISM12 This should never happen.",(allocator *)&aggr_const);
      SPxInternalCodeException::SPxInternalCodeException(pSVar20,(string *)&result);
      __cxa_throw(pSVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,-*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1638,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar17,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 0x1c;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems[6] = 0;
      scale1.m_backend.data._M_elems[7] = 0;
      scale1.m_backend.data._M_elems[8] = 0;
      scale1.m_backend.data._M_elems[9] = 0;
      scale1.m_backend.data._M_elems[10] = 0;
      scale1.m_backend.data._M_elems[0xb] = 0;
      scale1.m_backend.data._M_elems[0xc] = 0;
      scale1.m_backend.data._M_elems[0xd] = 0;
      scale1.m_backend.data._M_elems[0xe] = 0;
      scale1.m_backend.data._M_elems[0xf] = 0;
      scale1.m_backend.data._M_elems[0x10] = 0;
      scale1.m_backend.data._M_elems[0x11] = 0;
      scale1.m_backend.data._M_elems[0x12] = 0;
      scale1.m_backend.data._M_elems[0x13] = 0;
      scale1.m_backend.data._M_elems[0x14] = 0;
      scale1.m_backend.data._M_elems[0x15] = 0;
      scale1.m_backend.data._M_elems[0x16] = 0;
      scale1.m_backend.data._M_elems[0x17] = 0;
      scale1.m_backend.data._M_elems[0x18] = 0;
      scale1.m_backend.data._M_elems[0x19] = 0;
      scale1.m_backend.data._M_elems._104_5_ = 0;
      scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&scale1.m_backend,&local_1d38,&local_1638);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems[6] = 0;
      obj_j.m_backend.data._M_elems[7] = 0;
      obj_j.m_backend.data._M_elems[8] = 0;
      obj_j.m_backend.data._M_elems[9] = 0;
      obj_j.m_backend.data._M_elems[10] = 0;
      obj_j.m_backend.data._M_elems[0xb] = 0;
      obj_j.m_backend.data._M_elems[0xc] = 0;
      obj_j.m_backend.data._M_elems[0xd] = 0;
      obj_j.m_backend.data._M_elems[0xe] = 0;
      obj_j.m_backend.data._M_elems[0xf] = 0;
      obj_j.m_backend.data._M_elems[0x10] = 0;
      obj_j.m_backend.data._M_elems[0x11] = 0;
      obj_j.m_backend.data._M_elems[0x12] = 0;
      obj_j.m_backend.data._M_elems[0x13] = 0;
      obj_j.m_backend.data._M_elems[0x14] = 0;
      obj_j.m_backend.data._M_elems[0x15] = 0;
      obj_j.m_backend.data._M_elems[0x16] = 0;
      obj_j.m_backend.data._M_elems[0x17] = 0;
      obj_j.m_backend.data._M_elems[0x18] = 0;
      obj_j.m_backend.data._M_elems[0x19] = 0;
      obj_j.m_backend.data._M_elems._104_5_ = 0;
      obj_j.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&obj_j.m_backend,&local_18b8,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_1cb8);
    }
    pnVar26 = &result;
    pnVar25 = &local_1938;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1938.m_backend.exp = result.m_backend.exp;
    local_1938.m_backend.neg = result.m_backend.neg;
    local_1938.m_backend.fpclass = result.m_backend.fpclass;
    local_1938.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_17b8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar17,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 0x1c;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems[6] = 0;
      scale1.m_backend.data._M_elems[7] = 0;
      scale1.m_backend.data._M_elems[8] = 0;
      scale1.m_backend.data._M_elems[9] = 0;
      scale1.m_backend.data._M_elems[10] = 0;
      scale1.m_backend.data._M_elems[0xb] = 0;
      scale1.m_backend.data._M_elems[0xc] = 0;
      scale1.m_backend.data._M_elems[0xd] = 0;
      scale1.m_backend.data._M_elems[0xe] = 0;
      scale1.m_backend.data._M_elems[0xf] = 0;
      scale1.m_backend.data._M_elems[0x10] = 0;
      scale1.m_backend.data._M_elems[0x11] = 0;
      scale1.m_backend.data._M_elems[0x12] = 0;
      scale1.m_backend.data._M_elems[0x13] = 0;
      scale1.m_backend.data._M_elems[0x14] = 0;
      scale1.m_backend.data._M_elems[0x15] = 0;
      scale1.m_backend.data._M_elems[0x16] = 0;
      scale1.m_backend.data._M_elems[0x17] = 0;
      scale1.m_backend.data._M_elems[0x18] = 0;
      scale1.m_backend.data._M_elems[0x19] = 0;
      scale1.m_backend.data._M_elems._104_5_ = 0;
      scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&scale1.m_backend,&local_1d38,&local_17b8);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems[6] = 0;
      obj_j.m_backend.data._M_elems[7] = 0;
      obj_j.m_backend.data._M_elems[8] = 0;
      obj_j.m_backend.data._M_elems[9] = 0;
      obj_j.m_backend.data._M_elems[10] = 0;
      obj_j.m_backend.data._M_elems[0xb] = 0;
      obj_j.m_backend.data._M_elems[0xc] = 0;
      obj_j.m_backend.data._M_elems[0xd] = 0;
      obj_j.m_backend.data._M_elems[0xe] = 0;
      obj_j.m_backend.data._M_elems[0xf] = 0;
      obj_j.m_backend.data._M_elems[0x10] = 0;
      obj_j.m_backend.data._M_elems[0x11] = 0;
      obj_j.m_backend.data._M_elems[0x12] = 0;
      obj_j.m_backend.data._M_elems[0x13] = 0;
      obj_j.m_backend.data._M_elems[0x14] = 0;
      obj_j.m_backend.data._M_elems[0x15] = 0;
      obj_j.m_backend.data._M_elems[0x16] = 0;
      obj_j.m_backend.data._M_elems[0x17] = 0;
      obj_j.m_backend.data._M_elems[0x18] = 0;
      obj_j.m_backend.data._M_elems[0x19] = 0;
      obj_j.m_backend.data._M_elems._104_5_ = 0;
      obj_j.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&obj_j.m_backend,&local_18b8,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_1cb8);
    }
    pnVar26 = &result;
    pnVar25 = &local_19b8;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_19b8.m_backend.exp = result.m_backend.exp;
    local_19b8.m_backend.neg = result.m_backend.neg;
    local_19b8.m_backend.fpclass = result.m_backend.fpclass;
    local_19b8.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,-*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_16b8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar17,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 0x1c;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems[6] = 0;
      scale1.m_backend.data._M_elems[7] = 0;
      scale1.m_backend.data._M_elems[8] = 0;
      scale1.m_backend.data._M_elems[9] = 0;
      scale1.m_backend.data._M_elems[10] = 0;
      scale1.m_backend.data._M_elems[0xb] = 0;
      scale1.m_backend.data._M_elems[0xc] = 0;
      scale1.m_backend.data._M_elems[0xd] = 0;
      scale1.m_backend.data._M_elems[0xe] = 0;
      scale1.m_backend.data._M_elems[0xf] = 0;
      scale1.m_backend.data._M_elems[0x10] = 0;
      scale1.m_backend.data._M_elems[0x11] = 0;
      scale1.m_backend.data._M_elems[0x12] = 0;
      scale1.m_backend.data._M_elems[0x13] = 0;
      scale1.m_backend.data._M_elems[0x14] = 0;
      scale1.m_backend.data._M_elems[0x15] = 0;
      scale1.m_backend.data._M_elems[0x16] = 0;
      scale1.m_backend.data._M_elems[0x17] = 0;
      scale1.m_backend.data._M_elems[0x18] = 0;
      scale1.m_backend.data._M_elems[0x19] = 0;
      scale1.m_backend.data._M_elems._104_5_ = 0;
      scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&scale1.m_backend,&local_1cb8,&local_16b8);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems[6] = 0;
      obj_j.m_backend.data._M_elems[7] = 0;
      obj_j.m_backend.data._M_elems[8] = 0;
      obj_j.m_backend.data._M_elems[9] = 0;
      obj_j.m_backend.data._M_elems[10] = 0;
      obj_j.m_backend.data._M_elems[0xb] = 0;
      obj_j.m_backend.data._M_elems[0xc] = 0;
      obj_j.m_backend.data._M_elems[0xd] = 0;
      obj_j.m_backend.data._M_elems[0xe] = 0;
      obj_j.m_backend.data._M_elems[0xf] = 0;
      obj_j.m_backend.data._M_elems[0x10] = 0;
      obj_j.m_backend.data._M_elems[0x11] = 0;
      obj_j.m_backend.data._M_elems[0x12] = 0;
      obj_j.m_backend.data._M_elems[0x13] = 0;
      obj_j.m_backend.data._M_elems[0x14] = 0;
      obj_j.m_backend.data._M_elems[0x15] = 0;
      obj_j.m_backend.data._M_elems[0x16] = 0;
      obj_j.m_backend.data._M_elems[0x17] = 0;
      obj_j.m_backend.data._M_elems[0x18] = 0;
      obj_j.m_backend.data._M_elems[0x19] = 0;
      obj_j.m_backend.data._M_elems._104_5_ = 0;
      obj_j.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&obj_j.m_backend,&local_18b8,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_1d38);
    }
    pnVar26 = &result;
    pnVar25 = &local_1ab8;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1ab8.m_backend.exp = result.m_backend.exp;
    local_1ab8.m_backend.neg = result.m_backend.neg;
    local_1ab8.m_backend.fpclass = result.m_backend.fpclass;
    local_1ab8.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1738,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (!tVar15) {
      pcVar27 = &local_1738;
      goto LAB_00417893;
    }
LAB_0041783a:
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar17,(type *)0x0);
  }
  pnVar26 = &result;
  pnVar25 = &local_1b38;
  for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_1b38.m_backend.exp = result.m_backend.exp;
  local_1b38.m_backend.neg = result.m_backend.neg;
  local_1b38.m_backend.fpclass = result.m_backend.fpclass;
  local_1b38.m_backend.prec_elem = result.m_backend.prec_elem;
  pdVar17 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&result.m_backend,-*pdVar17,(type *)0x0);
  tVar15 = boost::multiprecision::operator<=
                     (&local_1938,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result.m_backend);
  if (tVar15) {
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator>=
                       (&local_19b8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    uVar43 = uVar42;
    lVar22 = lVar37;
    if (!tVar15) goto LAB_004179b2;
LAB_00417f0a:
    lVar37 = lVar35;
    lVar35 = lVar22;
    uVar42 = i_00;
    i_00 = uVar43;
    lVar22 = 0x1c;
    pcVar27 = &local_1cb8;
    pnVar26 = &result;
    for (lVar21 = lVar22; bVar14 = local_1cb8.neg, iVar49 = local_1cb8.exp, lVar21 != 0;
        lVar21 = lVar21 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    pcVar27 = &local_16b8;
    pnVar26 = &aggr_const;
    for (lVar21 = lVar22; bVar13 = local_16b8.neg, iVar4 = local_16b8.exp, lVar21 != 0;
        lVar21 = lVar21 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    pcVar27 = &local_1738;
    pnVar26 = &obj_j;
    for (lVar21 = lVar22; bVar11 = local_1738.neg, iVar10 = local_1738.exp, lVar21 != 0;
        lVar21 = lVar21 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    iVar46 = CONCAT31((int3)((uint)iVar46 >> 8),local_1738.neg);
    pcVar27 = &local_1d38;
    pcVar28 = &local_1cb8;
    for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
      (pcVar28->data)._M_elems[0] = (pcVar27->data)._M_elems[0];
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
      pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1cb8.exp = local_1d38.exp;
    local_1cb8.neg = local_1d38.neg;
    pnVar26 = &result;
    pcVar27 = &local_1d38;
    for (lVar21 = lVar22; uVar8 = local_1cb8._120_8_, lVar21 != 0; lVar21 = lVar21 + -1) {
      (pcVar27->data)._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1cb8.fpclass = local_1d38.fpclass;
    local_1cb8.prec_elem = local_1d38.prec_elem;
    uVar9 = local_1cb8._120_8_;
    local_1d38.exp = iVar49;
    local_1d38.neg = bVar14;
    local_1cb8.fpclass = (fpclass_type)uVar8;
    local_1cb8.prec_elem = SUB84(uVar8,4);
    local_1d38.fpclass = local_1cb8.fpclass;
    local_1d38.prec_elem = local_1cb8.prec_elem;
    pcVar27 = &local_1638;
    pcVar28 = &local_16b8;
    for (lVar21 = lVar22; uVar8 = local_16b8._120_8_, lVar21 != 0; lVar21 = lVar21 + -1) {
      (pcVar28->data)._M_elems[0] = (pcVar27->data)._M_elems[0];
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
      pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_16b8.exp = local_1638.exp;
    local_16b8.neg = local_1638.neg;
    pnVar26 = &aggr_const;
    pcVar27 = &local_1638;
    for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
      (pcVar27->data)._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_16b8.fpclass = local_1638.fpclass;
    local_16b8.prec_elem = local_1638.prec_elem;
    uVar12 = local_16b8._120_8_;
    local_1638.exp = iVar4;
    local_1638.neg = bVar13;
    local_16b8.fpclass = (fpclass_type)uVar8;
    local_16b8.prec_elem = SUB84(uVar8,4);
    local_1638.fpclass = local_16b8.fpclass;
    local_1638.prec_elem = local_16b8.prec_elem;
    pcVar27 = &local_17b8;
    pcVar28 = &local_1738;
    local_16b8._120_8_ = uVar12;
    for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
      (pcVar28->data)._M_elems[0] = (pcVar27->data)._M_elems[0];
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
      pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1738.exp = local_17b8.exp;
    local_1738.neg = local_17b8.neg;
    pnVar26 = &obj_j;
    pcVar27 = &local_17b8;
    for (; uVar8 = local_1738._120_8_, lVar22 != 0; lVar22 = lVar22 + -1) {
      (pcVar27->data)._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1738.fpclass = local_17b8.fpclass;
    local_1738.prec_elem = local_17b8.prec_elem;
    uVar12 = local_1738._120_8_;
    local_17b8.exp = iVar10;
    local_17b8.neg = bVar11;
    local_1738.fpclass = (fpclass_type)uVar8;
    local_1738.prec_elem = SUB84(uVar8,4);
    local_17b8.fpclass = local_1738.fpclass;
    local_17b8.prec_elem = local_1738.prec_elem;
    uVar45 = uVar42;
    lVar22 = lVar35;
    lVar21 = lVar37;
    local_1cb8._120_8_ = uVar9;
    local_1738._120_8_ = uVar12;
  }
  else {
LAB_004179b2:
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,-*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator<=
                       (&local_1ab8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&aggr_const.m_backend,*pdVar17,(type *)0x0);
      tVar15 = boost::multiprecision::operator>=
                         (&local_1b38,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&aggr_const.m_backend);
      uVar45 = i_00;
      lVar22 = lVar37;
      lVar21 = lVar35;
      if (!tVar15) goto LAB_00417a18;
      goto LAB_00418099;
    }
LAB_00417a18:
    lVar22 = 0x1c;
    pnVar26 = &local_1938;
    pnVar25 = &local_fb8;
    for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + (ulong)bVar39 * -8 + 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_fb8.m_backend.exp = local_1938.m_backend.exp;
    local_fb8.m_backend.neg = local_1938.m_backend.neg;
    local_fb8.m_backend.fpclass = local_1938.m_backend.fpclass;
    local_fb8.m_backend.prec_elem = local_1938.m_backend.prec_elem;
    pcVar27 = &local_16b8;
    pnVar26 = &local_1038;
    for (; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1038.m_backend.exp = local_16b8.exp;
    local_1038.m_backend.neg = local_16b8.neg;
    local_1038.m_backend.fpclass = local_16b8.fpclass;
    local_1038.m_backend.prec_elem = local_16b8.prec_elem;
    psVar36 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
               &psVar36->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar40 = Tolerances::epsilon((Tolerances *)
                                 CONCAT44(result.m_backend.data._M_elems[1],
                                          result.m_backend.data._M_elems[0]));
    bVar14 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_fb8,&local_1038,RVar40);
    if (bVar14) {
      lVar22 = 0x1c;
      pnVar26 = &local_19b8;
      pnVar25 = &local_10b8;
      for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + (ulong)bVar39 * -8 + 4);
        pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_10b8.m_backend.exp = local_19b8.m_backend.exp;
      local_10b8.m_backend.neg = local_19b8.m_backend.neg;
      local_10b8.m_backend.fpclass = local_19b8.m_backend.fpclass;
      local_10b8.m_backend.prec_elem = local_19b8.m_backend.prec_elem;
      pcVar27 = &local_1738;
      pnVar26 = &local_1138;
      for (; lVar22 != 0; lVar22 = lVar22 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_1138.m_backend.exp = local_1738.exp;
      local_1138.m_backend.neg = local_1738.neg;
      local_1138.m_backend.fpclass = local_1738.fpclass;
      local_1138.m_backend.prec_elem = local_1738.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&aggr_const,
                 &psVar36->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar40 = Tolerances::epsilon((Tolerances *)aggr_const.m_backend.data._M_elems._0_8_);
      bVar14 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_10b8,&local_1138,RVar40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (aggr_const.m_backend.data._M_elems + 2));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2))
      ;
      if (!bVar14) goto LAB_00417d18;
      lVar22 = 0x1c;
      pnVar26 = &local_1ab8;
      pnVar25 = &local_11b8;
      for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + (ulong)bVar39 * -8 + 4);
        pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_11b8.m_backend.exp = local_1ab8.m_backend.exp;
      local_11b8.m_backend.neg = local_1ab8.m_backend.neg;
      local_11b8.m_backend.fpclass = local_1ab8.m_backend.fpclass;
      local_11b8.m_backend.prec_elem = local_1ab8.m_backend.prec_elem;
      pcVar27 = &local_1638;
      pnVar26 = &local_1238;
      for (; lVar22 != 0; lVar22 = lVar22 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_1238.m_backend.exp = local_1638.exp;
      local_1238.m_backend.neg = local_1638.neg;
      local_1238.m_backend.fpclass = local_1638.fpclass;
      local_1238.m_backend.prec_elem = local_1638.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
                 &psVar36->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar40 = Tolerances::epsilon((Tolerances *)
                                   CONCAT44(result.m_backend.data._M_elems[1],
                                            result.m_backend.data._M_elems[0]));
      bVar14 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_11b8,&local_1238,RVar40);
      if (bVar14) {
        lVar22 = 0x1c;
        pnVar26 = &local_1b38;
        pnVar25 = &local_12b8;
        for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
          (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
          pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar26 + (ulong)bVar39 * -8 + 4);
          pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        local_12b8.m_backend.exp = local_1b38.m_backend.exp;
        local_12b8.m_backend.neg = local_1b38.m_backend.neg;
        local_12b8.m_backend.fpclass = local_1b38.m_backend.fpclass;
        local_12b8.m_backend.prec_elem = local_1b38.m_backend.prec_elem;
        pcVar27 = &local_17b8;
        pnVar26 = &local_1338;
        for (; lVar22 != 0; lVar22 = lVar22 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4)
          ;
          pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        local_1338.m_backend.exp = local_17b8.exp;
        local_1338.m_backend.neg = local_17b8.neg;
        local_1338.m_backend.fpclass = local_17b8.fpclass;
        local_1338.m_backend.prec_elem = local_17b8.prec_elem;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&aggr_const,
                   &psVar36->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar40 = Tolerances::epsilon((Tolerances *)aggr_const.m_backend.data._M_elems._0_8_);
        bVar14 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_12b8,&local_1338,RVar40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (aggr_const.m_backend.data._M_elems + 2));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2));
        uVar45 = i_00;
        lVar22 = lVar37;
        lVar21 = lVar35;
        if (!bVar14) goto LAB_00418099;
        pcVar27 = &local_1cb8;
        pmVar18 = local_3b0;
        for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
          *(uint *)pmVar18 = (((cpp_dec_float<200U,_int,_void> *)&pcVar27->data)->data)._M_elems[0];
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4)
          ;
          pmVar18 = pmVar18 + (ulong)bVar39 * -8 + 4;
        }
        local_340 = local_1cb8.exp;
        local_33c = (multiprecision)local_1cb8.neg;
        local_338 = local_1cb8.fpclass;
        iStack_334 = local_1cb8.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result,local_3b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_1cb8);
        pmVar18 = local_430;
        goto LAB_00417ebd;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2))
      ;
      uVar45 = i_00;
      lVar22 = lVar37;
      lVar21 = lVar35;
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2))
      ;
LAB_00417d18:
      lVar22 = 0x1c;
      pnVar26 = &local_1ab8;
      pnVar25 = &local_13b8;
      for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + (ulong)bVar39 * -8 + 4);
        pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_13b8.m_backend.exp = local_1ab8.m_backend.exp;
      local_13b8.m_backend.neg = local_1ab8.m_backend.neg;
      local_13b8.m_backend.fpclass = local_1ab8.m_backend.fpclass;
      local_13b8.m_backend.prec_elem = local_1ab8.m_backend.prec_elem;
      pcVar27 = &local_1638;
      pnVar26 = &local_1438;
      for (; lVar22 != 0; lVar22 = lVar22 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_1438.m_backend.exp = local_1638.exp;
      local_1438.m_backend.neg = local_1638.neg;
      local_1438.m_backend.fpclass = local_1638.fpclass;
      local_1438.m_backend.prec_elem = local_1638.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
                 &psVar36->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar40 = Tolerances::epsilon((Tolerances *)
                                   CONCAT44(result.m_backend.data._M_elems[1],
                                            result.m_backend.data._M_elems[0]));
      bVar14 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_13b8,&local_1438,RVar40);
      if (bVar14) {
        lVar22 = 0x1c;
        pnVar26 = &local_1b38;
        pnVar25 = &local_14b8;
        for (lVar21 = lVar22; lVar21 != 0; lVar21 = lVar21 + -1) {
          (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
          pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar26 + (ulong)bVar39 * -8 + 4);
          pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        local_14b8.m_backend.exp = local_1b38.m_backend.exp;
        local_14b8.m_backend.neg = local_1b38.m_backend.neg;
        local_14b8.m_backend.fpclass = local_1b38.m_backend.fpclass;
        local_14b8.m_backend.prec_elem = local_1b38.m_backend.prec_elem;
        pcVar27 = &local_17b8;
        pnVar26 = &local_1538;
        for (; lVar22 != 0; lVar22 = lVar22 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4)
          ;
          pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        local_1538.m_backend.exp = local_17b8.exp;
        local_1538.m_backend.neg = local_17b8.neg;
        local_1538.m_backend.fpclass = local_17b8.fpclass;
        local_1538.m_backend.prec_elem = local_17b8.prec_elem;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&aggr_const,
                   &psVar36->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar40 = Tolerances::epsilon((Tolerances *)aggr_const.m_backend.data._M_elems._0_8_);
        bVar14 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_14b8,&local_1538,RVar40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (aggr_const.m_backend.data._M_elems + 2));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2));
        uVar43 = uVar42;
        lVar22 = lVar37;
        if (bVar14) goto LAB_00417f0a;
      }
      else {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2));
      }
      pcVar27 = &local_1cb8;
      pmVar18 = amStack_4bc + 0xc;
      for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(uint *)pmVar18 = (((cpp_dec_float<200U,_int,_void> *)&pcVar27->data)->data)._M_elems[0];
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
        pmVar18 = pmVar18 + (ulong)bVar39 * -8 + 4;
      }
      local_440 = local_1cb8.exp;
      local_43c = (multiprecision)local_1cb8.neg;
      local_438 = local_1cb8.fpclass;
      iStack_434 = local_1cb8.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result,amStack_4bc + 0xc,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_1cb8);
      pmVar18 = local_530;
LAB_00417ebd:
      pcVar27 = &local_1d38;
      pmVar33 = pmVar18;
      for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(uint *)pmVar33 = (((cpp_dec_float<200U,_int,_void> *)&pcVar27->data)->data)._M_elems[0];
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
        pmVar33 = pmVar33 + (ulong)bVar39 * -8 + 4;
      }
      *(int *)(pmVar18 + 0x70) = local_1d38.exp;
      pmVar18[0x74] = (multiprecision)local_1d38.neg;
      *(undefined8 *)(pmVar18 + 0x78) = local_1d38._120_8_;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&aggr_const,pmVar18,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_1d38);
      tVar15 = boost::multiprecision::operator>(&result,&aggr_const);
      uVar43 = uVar42;
      uVar45 = i_00;
      lVar22 = lVar37;
      lVar21 = lVar35;
      if (!tVar15) goto LAB_00417f0a;
    }
  }
LAB_00418099:
  pIVar38 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  pDVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey;
  iVar49 = pDVar7[lVar35].idx;
  iVar4 = pDVar7[lVar37].idx;
  aggr_const.m_backend.fpclass = cpp_dec_float_finite;
  aggr_const.m_backend.prec_elem = 0x1c;
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  aggr_const.m_backend.data._M_elems[2] = 0;
  aggr_const.m_backend.data._M_elems[3] = 0;
  aggr_const.m_backend.data._M_elems[4] = 0;
  aggr_const.m_backend.data._M_elems[5] = 0;
  aggr_const.m_backend.data._M_elems[6] = 0;
  aggr_const.m_backend.data._M_elems[7] = 0;
  aggr_const.m_backend.data._M_elems[8] = 0;
  aggr_const.m_backend.data._M_elems[9] = 0;
  aggr_const.m_backend.data._M_elems[10] = 0;
  aggr_const.m_backend.data._M_elems[0xb] = 0;
  aggr_const.m_backend.data._M_elems[0xc] = 0;
  aggr_const.m_backend.data._M_elems[0xd] = 0;
  aggr_const.m_backend.data._M_elems[0xe] = 0;
  aggr_const.m_backend.data._M_elems[0xf] = 0;
  aggr_const.m_backend.data._M_elems[0x10] = 0;
  aggr_const.m_backend.data._M_elems[0x11] = 0;
  aggr_const.m_backend.data._M_elems[0x12] = 0;
  aggr_const.m_backend.data._M_elems[0x13] = 0;
  aggr_const.m_backend.data._M_elems[0x14] = 0;
  aggr_const.m_backend.data._M_elems[0x15] = 0;
  aggr_const.m_backend.data._M_elems[0x16] = 0;
  aggr_const.m_backend.data._M_elems[0x17] = 0;
  aggr_const.m_backend.data._M_elems[0x18] = 0;
  aggr_const.m_backend.data._M_elems[0x19] = 0;
  aggr_const.m_backend.data._M_elems._104_5_ = 0;
  aggr_const.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  aggr_const.m_backend.exp = 0;
  aggr_const.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&aggr_const.m_backend,&local_1d38,&local_1cb8);
  pcVar27 = &aggr_const.m_backend;
  pnVar26 = &result;
  for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar39 * -8 + 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  result.m_backend.exp = aggr_const.m_backend.exp;
  result.m_backend.neg = aggr_const.m_backend.neg;
  result.m_backend.fpclass = aggr_const.m_backend.fpclass;
  result.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
  if (aggr_const.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
     ) {
    result.m_backend.neg = (bool)(aggr_const.m_backend.neg ^ 1);
  }
  pIVar29 = pIVar38 + iVar49;
  pIVar38 = pIVar38 + iVar4;
  aggr_const.m_backend.fpclass = cpp_dec_float_finite;
  aggr_const.m_backend.prec_elem = 0x1c;
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  aggr_const.m_backend.data._M_elems[2] = 0;
  aggr_const.m_backend.data._M_elems[3] = 0;
  aggr_const.m_backend.data._M_elems[4] = 0;
  aggr_const.m_backend.data._M_elems[5] = 0;
  aggr_const.m_backend.data._M_elems[6] = 0;
  aggr_const.m_backend.data._M_elems[7] = 0;
  aggr_const.m_backend.data._M_elems[8] = 0;
  aggr_const.m_backend.data._M_elems[9] = 0;
  aggr_const.m_backend.data._M_elems[10] = 0;
  aggr_const.m_backend.data._M_elems[0xb] = 0;
  aggr_const.m_backend.data._M_elems[0xc] = 0;
  aggr_const.m_backend.data._M_elems[0xd] = 0;
  aggr_const.m_backend.data._M_elems[0xe] = 0;
  aggr_const.m_backend.data._M_elems[0xf] = 0;
  aggr_const.m_backend.data._M_elems[0x10] = 0;
  aggr_const.m_backend.data._M_elems[0x11] = 0;
  aggr_const.m_backend.data._M_elems[0x12] = 0;
  aggr_const.m_backend.data._M_elems[0x13] = 0;
  aggr_const.m_backend.data._M_elems[0x14] = 0;
  aggr_const.m_backend.data._M_elems[0x15] = 0;
  aggr_const.m_backend.data._M_elems[0x16] = 0;
  aggr_const.m_backend.data._M_elems[0x17] = 0;
  aggr_const.m_backend.data._M_elems[0x18] = 0;
  aggr_const.m_backend.data._M_elems[0x19] = 0;
  aggr_const.m_backend.data._M_elems._104_5_ = 0;
  aggr_const.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  aggr_const.m_backend.exp = 0;
  aggr_const.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&aggr_const.m_backend,&local_18b8,&local_1cb8);
  lVar35 = 0x80;
  pIVar54 = pIVar38;
  pIVar51 = pIVar29;
  for (lVar37 = 0; lVar24 = 0x1c,
      lVar37 < (pIVar29->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar37 = lVar37 + 1) {
    puVar19 = (uint *)((long)(((pIVar29->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data._M_elems + lVar35);
    uVar43 = *puVar19;
    puVar30 = puVar19 + -0x20;
    pnVar26 = &obj_j;
    for (lVar23 = lVar24; lVar23 != 0; lVar23 = lVar23 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = *puVar30;
      puVar30 = puVar30 + (ulong)bVar39 * -2 + 1;
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    obj_j.m_backend.exp = puVar19[-4];
    obj_j.m_backend.neg = SUB41(puVar19[-3],0);
    obj_j.m_backend.fpclass = puVar19[-2];
    obj_j.m_backend.prec_elem = puVar19[-1];
    if (uVar43 != *i) {
      iVar46 = (int)lVar35;
      in_stack_ffffffffffffdfe4 = (undefined4)((ulong)lVar35 >> 0x20);
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar31 = pnVar5 + (int)uVar43;
      pnVar26 = &scale1;
      for (lVar35 = lVar24; lVar35 != 0; lVar35 = lVar35 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = (pnVar31->m_backend).data._M_elems[0];
        pnVar31 = (pointer)((long)pnVar31 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      scale1.m_backend.exp = pnVar5[(int)uVar43].m_backend.exp;
      scale1.m_backend.neg = pnVar5[(int)uVar43].m_backend.neg;
      scale1.m_backend.fpclass = pnVar5[(int)uVar43].m_backend.fpclass;
      scale1.m_backend.prec_elem = pnVar5[(int)uVar43].m_backend.prec_elem;
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar31 = pnVar5 + (int)uVar43;
      pnVar26 = &scale2;
      for (; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = (pnVar31->m_backend).data._M_elems[0];
        pnVar31 = (pointer)((long)pnVar31 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      scale2.m_backend.exp = pnVar5[(int)uVar43].m_backend.exp;
      scale2.m_backend.neg = pnVar5[(int)uVar43].m_backend.neg;
      scale2.m_backend.fpclass = pnVar5[(int)uVar43].m_backend.fpclass;
      scale2.m_backend.prec_elem = pnVar5[(int)uVar43].m_backend.prec_elem;
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&z1.m_backend,-*pdVar17,(type *)0x0);
      tVar15 = boost::multiprecision::operator>
                         (&scale1,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&z1.m_backend);
      if (tVar15) {
        z2.m_backend.fpclass = cpp_dec_float_finite;
        z2.m_backend.prec_elem = 0x1c;
        z2.m_backend.data._M_elems[0] = 0;
        z2.m_backend.data._M_elems[1] = 0;
        z2.m_backend.data._M_elems[2] = 0;
        z2.m_backend.data._M_elems[3] = 0;
        z2.m_backend.data._M_elems[4] = 0;
        z2.m_backend.data._M_elems[5] = 0;
        z2.m_backend.data._M_elems[6] = 0;
        z2.m_backend.data._M_elems[7] = 0;
        z2.m_backend.data._M_elems[8] = 0;
        z2.m_backend.data._M_elems[9] = 0;
        z2.m_backend.data._M_elems[10] = 0;
        z2.m_backend.data._M_elems[0xb] = 0;
        z2.m_backend.data._M_elems[0xc] = 0;
        z2.m_backend.data._M_elems[0xd] = 0;
        z2.m_backend.data._M_elems[0xe] = 0;
        z2.m_backend.data._M_elems[0xf] = 0;
        z2.m_backend.data._M_elems[0x10] = 0;
        z2.m_backend.data._M_elems[0x11] = 0;
        z2.m_backend.data._M_elems[0x12] = 0;
        z2.m_backend.data._M_elems[0x13] = 0;
        z2.m_backend.data._M_elems[0x14] = 0;
        z2.m_backend.data._M_elems[0x15] = 0;
        z2.m_backend.data._M_elems[0x16] = 0;
        z2.m_backend.data._M_elems[0x17] = 0;
        z2.m_backend.data._M_elems[0x18] = 0;
        z2.m_backend.data._M_elems[0x19] = 0;
        z2.m_backend.data._M_elems._104_5_ = 0;
        z2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        z2.m_backend.exp = 0;
        z2.m_backend.neg = false;
        pIVar29 = pIVar51;
        pIVar38 = pIVar54;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&z2.m_backend,&aggr_const.m_backend,&obj_j.m_backend);
        z1.m_backend.fpclass = cpp_dec_float_finite;
        z1.m_backend.prec_elem = 0x1c;
        z1.m_backend.data._M_elems[0] = 0;
        z1.m_backend.data._M_elems[1] = 0;
        z1.m_backend.data._M_elems[2] = 0;
        z1.m_backend.data._M_elems[3] = 0;
        z1.m_backend.data._M_elems[4] = 0;
        z1.m_backend.data._M_elems[5] = 0;
        z1.m_backend.data._M_elems[6] = 0;
        z1.m_backend.data._M_elems[7] = 0;
        z1.m_backend.data._M_elems[8] = 0;
        z1.m_backend.data._M_elems[9] = 0;
        z1.m_backend.data._M_elems[10] = 0;
        z1.m_backend.data._M_elems[0xb] = 0;
        z1.m_backend.data._M_elems[0xc] = 0;
        z1.m_backend.data._M_elems[0xd] = 0;
        z1.m_backend.data._M_elems[0xe] = 0;
        z1.m_backend.data._M_elems[0xf] = 0;
        z1.m_backend.data._M_elems[0x10] = 0;
        z1.m_backend.data._M_elems[0x11] = 0;
        z1.m_backend.data._M_elems[0x12] = 0;
        z1.m_backend.data._M_elems[0x13] = 0;
        z1.m_backend.data._M_elems[0x14] = 0;
        z1.m_backend.data._M_elems[0x15] = 0;
        z1.m_backend.data._M_elems[0x16] = 0;
        z1.m_backend.data._M_elems[0x17] = 0;
        z1.m_backend.data._M_elems[0x18] = 0;
        z1.m_backend.data._M_elems[0x19] = 0;
        z1.m_backend.data._M_elems._104_5_ = 0;
        z1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        z1.m_backend.exp = 0;
        z1.m_backend.neg = false;
        pIVar51 = pIVar29;
        pIVar54 = pIVar38;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&z1.m_backend,&scale1.m_backend,&z2.m_backend);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(lp,(ulong)uVar43,&z1.m_backend,0);
        piVar1 = &(pSVar48->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_chgLRhs;
        *piVar1 = *piVar1 + 1;
      }
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&z1.m_backend,*pdVar17,(type *)0x0);
      tVar15 = boost::multiprecision::operator<
                         (&scale2,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&z1.m_backend);
      if (tVar15) {
        z2.m_backend.fpclass = cpp_dec_float_finite;
        z2.m_backend.prec_elem = 0x1c;
        z2.m_backend.data._M_elems[0] = 0;
        z2.m_backend.data._M_elems[1] = 0;
        z2.m_backend.data._M_elems[2] = 0;
        z2.m_backend.data._M_elems[3] = 0;
        z2.m_backend.data._M_elems[4] = 0;
        z2.m_backend.data._M_elems[5] = 0;
        z2.m_backend.data._M_elems[6] = 0;
        z2.m_backend.data._M_elems[7] = 0;
        z2.m_backend.data._M_elems[8] = 0;
        z2.m_backend.data._M_elems[9] = 0;
        z2.m_backend.data._M_elems[10] = 0;
        z2.m_backend.data._M_elems[0xb] = 0;
        z2.m_backend.data._M_elems[0xc] = 0;
        z2.m_backend.data._M_elems[0xd] = 0;
        z2.m_backend.data._M_elems[0xe] = 0;
        z2.m_backend.data._M_elems[0xf] = 0;
        z2.m_backend.data._M_elems[0x10] = 0;
        z2.m_backend.data._M_elems[0x11] = 0;
        z2.m_backend.data._M_elems[0x12] = 0;
        z2.m_backend.data._M_elems[0x13] = 0;
        z2.m_backend.data._M_elems[0x14] = 0;
        z2.m_backend.data._M_elems[0x15] = 0;
        z2.m_backend.data._M_elems[0x16] = 0;
        z2.m_backend.data._M_elems[0x17] = 0;
        z2.m_backend.data._M_elems[0x18] = 0;
        z2.m_backend.data._M_elems[0x19] = 0;
        z2.m_backend.data._M_elems._104_5_ = 0;
        z2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        z2.m_backend.exp = 0;
        z2.m_backend.neg = false;
        pIVar29 = pIVar51;
        pIVar38 = pIVar54;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&z2.m_backend,&aggr_const.m_backend,&obj_j.m_backend);
        z1.m_backend.fpclass = cpp_dec_float_finite;
        z1.m_backend.prec_elem = 0x1c;
        z1.m_backend.data._M_elems[0] = 0;
        z1.m_backend.data._M_elems[1] = 0;
        z1.m_backend.data._M_elems[2] = 0;
        z1.m_backend.data._M_elems[3] = 0;
        z1.m_backend.data._M_elems[4] = 0;
        z1.m_backend.data._M_elems[5] = 0;
        z1.m_backend.data._M_elems[6] = 0;
        z1.m_backend.data._M_elems[7] = 0;
        z1.m_backend.data._M_elems[8] = 0;
        z1.m_backend.data._M_elems[9] = 0;
        z1.m_backend.data._M_elems[10] = 0;
        z1.m_backend.data._M_elems[0xb] = 0;
        z1.m_backend.data._M_elems[0xc] = 0;
        z1.m_backend.data._M_elems[0xd] = 0;
        z1.m_backend.data._M_elems[0xe] = 0;
        z1.m_backend.data._M_elems[0xf] = 0;
        z1.m_backend.data._M_elems[0x10] = 0;
        z1.m_backend.data._M_elems[0x11] = 0;
        z1.m_backend.data._M_elems[0x12] = 0;
        z1.m_backend.data._M_elems[0x13] = 0;
        z1.m_backend.data._M_elems[0x14] = 0;
        z1.m_backend.data._M_elems[0x15] = 0;
        z1.m_backend.data._M_elems[0x16] = 0;
        z1.m_backend.data._M_elems[0x17] = 0;
        z1.m_backend.data._M_elems[0x18] = 0;
        z1.m_backend.data._M_elems[0x19] = 0;
        z1.m_backend.data._M_elems._104_5_ = 0;
        z1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        z1.m_backend.exp = 0;
        z1.m_backend.neg = false;
        pIVar51 = pIVar29;
        pIVar54 = pIVar38;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&z1.m_backend,&scale2.m_backend,&z2.m_backend);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(lp,(ulong)uVar43,&z1.m_backend,0);
        piVar1 = &(pSVar48->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_chgLRhs;
        *piVar1 = *piVar1 + 1;
      }
      z1.m_backend.fpclass = cpp_dec_float_finite;
      z1.m_backend.prec_elem = 0x1c;
      z1.m_backend.data._M_elems[0] = 0;
      z1.m_backend.data._M_elems[1] = 0;
      z1.m_backend.data._M_elems[2] = 0;
      z1.m_backend.data._M_elems[3] = 0;
      z1.m_backend.data._M_elems[4] = 0;
      z1.m_backend.data._M_elems[5] = 0;
      z1.m_backend.data._M_elems[6] = 0;
      z1.m_backend.data._M_elems[7] = 0;
      z1.m_backend.data._M_elems[8] = 0;
      z1.m_backend.data._M_elems[9] = 0;
      z1.m_backend.data._M_elems[10] = 0;
      z1.m_backend.data._M_elems[0xb] = 0;
      z1.m_backend.data._M_elems[0xc] = 0;
      z1.m_backend.data._M_elems[0xd] = 0;
      z1.m_backend.data._M_elems[0xe] = 0;
      z1.m_backend.data._M_elems[0xf] = 0;
      z1.m_backend.data._M_elems[0x10] = 0;
      z1.m_backend.data._M_elems[0x11] = 0;
      z1.m_backend.data._M_elems[0x12] = 0;
      z1.m_backend.data._M_elems[0x13] = 0;
      z1.m_backend.data._M_elems[0x14] = 0;
      z1.m_backend.data._M_elems[0x15] = 0;
      z1.m_backend.data._M_elems[0x16] = 0;
      z1.m_backend.data._M_elems[0x17] = 0;
      z1.m_backend.data._M_elems[0x18] = 0;
      z1.m_backend.data._M_elems[0x19] = 0;
      z1.m_backend.data._M_elems._104_5_ = 0;
      z1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      z1.m_backend.exp = 0;
      z1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&z1.m_backend,&result.m_backend,&obj_j.m_backend);
      uVar16 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)pIVar38,uVar43);
      if (-1 < (int)uVar16) {
        pNVar6 = (pIVar38->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pNVar32 = pNVar6 + uVar16;
        pcVar27 = &z2.m_backend;
        for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
          (pcVar27->data)._M_elems[0] = (pNVar32->val).m_backend.data._M_elems[0];
          pNVar32 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar32 + ((ulong)bVar39 * -2 + 1) * 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar39 * -8 + 4);
        }
        z2.m_backend.exp = pNVar6[uVar16].val.m_backend.exp;
        z2.m_backend.neg = pNVar6[uVar16].val.m_backend.neg;
        z2.m_backend.fpclass = pNVar6[uVar16].val.m_backend.fpclass;
        z2.m_backend.prec_elem = pNVar6[uVar16].val.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&z1.m_backend,&z2.m_backend);
        piVar1 = &(pSVar48->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remNzos;
        *piVar1 = *piVar1 + 1;
      }
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x43])(lp,(ulong)uVar43,(ulong)uVar42,&z1.m_backend,0);
      lVar35 = CONCAT44(in_stack_ffffffffffffdfe4,iVar46);
    }
    lVar35 = lVar35 + 0x84;
  }
  lp_00 = lp;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj(&obj_j,lp,i_00);
  pnVar26 = &obj_j;
  pnVar25 = &local_5b0;
  for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_5b0.m_backend.exp = obj_j.m_backend.exp;
  local_5b0.m_backend.neg = obj_j.m_backend.neg;
  local_5b0.m_backend.fpclass = obj_j.m_backend.fpclass;
  local_5b0.m_backend.prec_elem = obj_j.m_backend.prec_elem;
  this_01 = pSVar48;
  epsZero(&local_630,pSVar48);
  bVar14 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_5b0,&local_630);
  uVar43 = uVar42;
  if (bVar14) {
    result_28.m_backend.fpclass = cpp_dec_float_finite;
    result_28.m_backend.prec_elem = 0x1c;
    result_28.m_backend.data._M_elems[0] = 0;
    result_28.m_backend.data._M_elems[1] = 0;
    result_28.m_backend.data._M_elems[2] = 0;
    result_28.m_backend.data._M_elems[3] = 0;
    result_28.m_backend.data._M_elems[4] = 0;
    result_28.m_backend.data._M_elems[5] = 0;
    result_28.m_backend.data._M_elems[6] = 0;
    result_28.m_backend.data._M_elems[7] = 0;
    result_28.m_backend.data._M_elems[8] = 0;
    result_28.m_backend.data._M_elems[9] = 0;
    result_28.m_backend.data._M_elems[10] = 0;
    result_28.m_backend.data._M_elems[0xb] = 0;
    result_28.m_backend.data._M_elems[0xc] = 0;
    result_28.m_backend.data._M_elems[0xd] = 0;
    result_28.m_backend.data._M_elems[0xe] = 0;
    result_28.m_backend.data._M_elems[0xf] = 0;
    result_28.m_backend.data._M_elems[0x10] = 0;
    result_28.m_backend.data._M_elems[0x11] = 0;
    result_28.m_backend.data._M_elems[0x12] = 0;
    result_28.m_backend.data._M_elems[0x13] = 0;
    result_28.m_backend.data._M_elems[0x14] = 0;
    result_28.m_backend.data._M_elems[0x15] = 0;
    result_28.m_backend.data._M_elems[0x16] = 0;
    result_28.m_backend.data._M_elems[0x17] = 0;
    result_28.m_backend.data._M_elems[0x18] = 0;
    result_28.m_backend.data._M_elems[0x19] = 0;
    result_28.m_backend.data._M_elems._104_5_ = 0;
    result_28.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_28.m_backend.exp = 0;
    result_28.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_28.m_backend,&aggr_const.m_backend,&obj_j.m_backend);
    (*(pSVar48->
      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxSimplifier[0x11])(pSVar48,&result_28.m_backend);
    uVar43 = uVar42;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&scale1.m_backend,lp,uVar42);
    z1.m_backend.fpclass = cpp_dec_float_finite;
    z1.m_backend.prec_elem = 0x1c;
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0;
    z1.m_backend.data._M_elems[2] = 0;
    z1.m_backend.data._M_elems[3] = 0;
    z1.m_backend.data._M_elems[4] = 0;
    z1.m_backend.data._M_elems[5] = 0;
    z1.m_backend.data._M_elems[6] = 0;
    z1.m_backend.data._M_elems[7] = 0;
    z1.m_backend.data._M_elems[8] = 0;
    z1.m_backend.data._M_elems[9] = 0;
    z1.m_backend.data._M_elems[10] = 0;
    z1.m_backend.data._M_elems[0xb] = 0;
    z1.m_backend.data._M_elems[0xc] = 0;
    z1.m_backend.data._M_elems[0xd] = 0;
    z1.m_backend.data._M_elems[0xe] = 0;
    z1.m_backend.data._M_elems[0xf] = 0;
    z1.m_backend.data._M_elems[0x10] = 0;
    z1.m_backend.data._M_elems[0x11] = 0;
    z1.m_backend.data._M_elems[0x12] = 0;
    z1.m_backend.data._M_elems[0x13] = 0;
    z1.m_backend.data._M_elems[0x14] = 0;
    z1.m_backend.data._M_elems[0x15] = 0;
    z1.m_backend.data._M_elems[0x16] = 0;
    z1.m_backend.data._M_elems[0x17] = 0;
    z1.m_backend.data._M_elems[0x18] = 0;
    z1.m_backend.data._M_elems[0x19] = 0;
    z1.m_backend.data._M_elems._104_5_ = 0;
    z1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    z1.m_backend.exp = 0;
    z1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&z1.m_backend,&result.m_backend,&obj_j.m_backend);
    scale2.m_backend.fpclass = cpp_dec_float_finite;
    scale2.m_backend.prec_elem = 0x1c;
    scale2.m_backend.data._M_elems[0] = 0;
    scale2.m_backend.data._M_elems[1] = 0;
    scale2.m_backend.data._M_elems[2] = 0;
    scale2.m_backend.data._M_elems[3] = 0;
    scale2.m_backend.data._M_elems[4] = 0;
    scale2.m_backend.data._M_elems[5] = 0;
    scale2.m_backend.data._M_elems[6] = 0;
    scale2.m_backend.data._M_elems[7] = 0;
    scale2.m_backend.data._M_elems[8] = 0;
    scale2.m_backend.data._M_elems[9] = 0;
    scale2.m_backend.data._M_elems[10] = 0;
    scale2.m_backend.data._M_elems[0xb] = 0;
    scale2.m_backend.data._M_elems[0xc] = 0;
    scale2.m_backend.data._M_elems[0xd] = 0;
    scale2.m_backend.data._M_elems[0xe] = 0;
    scale2.m_backend.data._M_elems[0xf] = 0;
    scale2.m_backend.data._M_elems[0x10] = 0;
    scale2.m_backend.data._M_elems[0x11] = 0;
    scale2.m_backend.data._M_elems[0x12] = 0;
    scale2.m_backend.data._M_elems[0x13] = 0;
    scale2.m_backend.data._M_elems[0x14] = 0;
    scale2.m_backend.data._M_elems[0x15] = 0;
    scale2.m_backend.data._M_elems[0x16] = 0;
    scale2.m_backend.data._M_elems[0x17] = 0;
    scale2.m_backend.data._M_elems[0x18] = 0;
    scale2.m_backend.data._M_elems[0x19] = 0;
    scale2.m_backend.data._M_elems._104_5_ = 0;
    scale2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    scale2.m_backend.exp = 0;
    scale2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&scale2.m_backend,&scale1.m_backend,&z1.m_backend);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(lp,(ulong)uVar42,&scale2.m_backend,0);
  }
  pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)0x1c;
  pcVar27 = &local_18b8;
  psVar34 = local_6b0;
  for (pnVar25 = pnVar26;
      pnVar25 !=
      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)0x0; pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)&pnVar25[-1].m_backend.prec_elem + 3)) {
    *(uint *)psVar34 = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    psVar34 = psVar34 + (ulong)bVar39 * -8 + 4;
  }
  local_640 = local_18b8.exp;
  local_63c = local_18b8.neg;
  local_638 = local_18b8.fpclass;
  iStack_634 = local_18b8.prec_elem;
  result_31.m_backend.fpclass = cpp_dec_float_finite;
  result_31.m_backend.prec_elem = 0x1c;
  result_31.m_backend.data._M_elems[0] = 0;
  result_31.m_backend.data._M_elems[1] = 0;
  result_31.m_backend.data._M_elems[2] = 0;
  result_31.m_backend.data._M_elems[3] = 0;
  result_31.m_backend.data._M_elems[4] = 0;
  result_31.m_backend.data._M_elems[5] = 0;
  result_31.m_backend.data._M_elems[6] = 0;
  result_31.m_backend.data._M_elems[7] = 0;
  result_31.m_backend.data._M_elems[8] = 0;
  result_31.m_backend.data._M_elems[9] = 0;
  result_31.m_backend.data._M_elems[10] = 0;
  result_31.m_backend.data._M_elems[0xb] = 0;
  result_31.m_backend.data._M_elems[0xc] = 0;
  result_31.m_backend.data._M_elems[0xd] = 0;
  result_31.m_backend.data._M_elems[0xe] = 0;
  result_31.m_backend.data._M_elems[0xf] = 0;
  result_31.m_backend.data._M_elems[0x10] = 0;
  result_31.m_backend.data._M_elems[0x11] = 0;
  result_31.m_backend.data._M_elems[0x12] = 0;
  result_31.m_backend.data._M_elems[0x13] = 0;
  result_31.m_backend.data._M_elems[0x14] = 0;
  result_31.m_backend.data._M_elems[0x15] = 0;
  result_31.m_backend.data._M_elems[0x16] = 0;
  result_31.m_backend.data._M_elems[0x17] = 0;
  result_31.m_backend.data._M_elems[0x18] = 0;
  result_31.m_backend.data._M_elems[0x19] = 0;
  result_31.m_backend.data._M_elems._104_5_ = 0;
  result_31.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_31.m_backend.exp = 0;
  result_31.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_31.m_backend,&local_1cb8,&local_1738);
  maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale1,local_6b0,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&result_31.m_backend,pnVar25);
  pcVar27 = &local_18b8;
  psVar34 = local_730;
  for (; pnVar26 !=
         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)0x0;
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)&pnVar26[-1].m_backend.prec_elem + 3)) {
    *(uint *)psVar34 = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    psVar34 = psVar34 + (ulong)bVar39 * -8 + 4;
  }
  local_6c0 = local_18b8.exp;
  local_6bc = local_18b8.neg;
  local_6b8 = local_18b8.fpclass;
  iStack_6b4 = local_18b8.prec_elem;
  result_32.m_backend.fpclass = cpp_dec_float_finite;
  result_32.m_backend.prec_elem = 0x1c;
  result_32.m_backend.data._M_elems[0] = 0;
  result_32.m_backend.data._M_elems[1] = 0;
  result_32.m_backend.data._M_elems[2] = 0;
  result_32.m_backend.data._M_elems[3] = 0;
  result_32.m_backend.data._M_elems[4] = 0;
  result_32.m_backend.data._M_elems[5] = 0;
  result_32.m_backend.data._M_elems[6] = 0;
  result_32.m_backend.data._M_elems[7] = 0;
  result_32.m_backend.data._M_elems[8] = 0;
  result_32.m_backend.data._M_elems[9] = 0;
  result_32.m_backend.data._M_elems[10] = 0;
  result_32.m_backend.data._M_elems[0xb] = 0;
  result_32.m_backend.data._M_elems[0xc] = 0;
  result_32.m_backend.data._M_elems[0xd] = 0;
  result_32.m_backend.data._M_elems[0xe] = 0;
  result_32.m_backend.data._M_elems[0xf] = 0;
  result_32.m_backend.data._M_elems[0x10] = 0;
  result_32.m_backend.data._M_elems[0x11] = 0;
  result_32.m_backend.data._M_elems[0x12] = 0;
  result_32.m_backend.data._M_elems[0x13] = 0;
  result_32.m_backend.data._M_elems[0x14] = 0;
  result_32.m_backend.data._M_elems[0x15] = 0;
  result_32.m_backend.data._M_elems[0x16] = 0;
  result_32.m_backend.data._M_elems[0x17] = 0;
  result_32.m_backend.data._M_elems[0x18] = 0;
  result_32.m_backend.data._M_elems[0x19] = 0;
  result_32.m_backend.data._M_elems._104_5_ = 0;
  result_32.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_32.m_backend.exp = 0;
  result_32.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_32.m_backend,&local_1cb8,&local_16b8);
  maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale2,local_730,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&result_32.m_backend,pnVar26);
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar15 = boost::multiprecision::operator<(&scale1,(double *)&z1);
  if (tVar15) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&scale1,1.0);
  }
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar15 = boost::multiprecision::operator<(&scale2,(double *)&z1);
  if (tVar15) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&scale2,1.0);
  }
  z2.m_backend.fpclass = cpp_dec_float_finite;
  z2.m_backend.prec_elem = 0x1c;
  z2.m_backend.data._M_elems[0] = 0;
  z2.m_backend.data._M_elems[1] = 0;
  z2.m_backend.data._M_elems[2] = 0;
  z2.m_backend.data._M_elems[3] = 0;
  z2.m_backend.data._M_elems[4] = 0;
  z2.m_backend.data._M_elems[5] = 0;
  z2.m_backend.data._M_elems[6] = 0;
  z2.m_backend.data._M_elems[7] = 0;
  z2.m_backend.data._M_elems[8] = 0;
  z2.m_backend.data._M_elems[9] = 0;
  z2.m_backend.data._M_elems[10] = 0;
  z2.m_backend.data._M_elems[0xb] = 0;
  z2.m_backend.data._M_elems[0xc] = 0;
  z2.m_backend.data._M_elems[0xd] = 0;
  z2.m_backend.data._M_elems[0xe] = 0;
  z2.m_backend.data._M_elems[0xf] = 0;
  z2.m_backend.data._M_elems[0x10] = 0;
  z2.m_backend.data._M_elems[0x11] = 0;
  z2.m_backend.data._M_elems[0x12] = 0;
  z2.m_backend.data._M_elems[0x13] = 0;
  z2.m_backend.data._M_elems[0x14] = 0;
  z2.m_backend.data._M_elems[0x15] = 0;
  z2.m_backend.data._M_elems[0x16] = 0;
  z2.m_backend.data._M_elems[0x17] = 0;
  z2.m_backend.data._M_elems[0x18] = 0;
  z2.m_backend.data._M_elems[0x19] = 0;
  z2.m_backend.data._M_elems._104_5_ = 0;
  z2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  z2.m_backend.exp = 0;
  z2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&z2.m_backend,&local_18b8,&scale1.m_backend);
  result_34.m_backend.fpclass = cpp_dec_float_finite;
  result_34.m_backend.prec_elem = 0x1c;
  result_34.m_backend.data._M_elems[0] = 0;
  result_34.m_backend.data._M_elems[1] = 0;
  result_34.m_backend.data._M_elems[2] = 0;
  result_34.m_backend.data._M_elems[3] = 0;
  result_34.m_backend.data._M_elems[4] = 0;
  result_34.m_backend.data._M_elems[5] = 0;
  result_34.m_backend.data._M_elems[6] = 0;
  result_34.m_backend.data._M_elems[7] = 0;
  result_34.m_backend.data._M_elems[8] = 0;
  result_34.m_backend.data._M_elems[9] = 0;
  result_34.m_backend.data._M_elems[10] = 0;
  result_34.m_backend.data._M_elems[0xb] = 0;
  result_34.m_backend.data._M_elems[0xc] = 0;
  result_34.m_backend.data._M_elems[0xd] = 0;
  result_34.m_backend.data._M_elems[0xe] = 0;
  result_34.m_backend.data._M_elems[0xf] = 0;
  result_34.m_backend.data._M_elems[0x10] = 0;
  result_34.m_backend.data._M_elems[0x11] = 0;
  result_34.m_backend.data._M_elems[0x12] = 0;
  result_34.m_backend.data._M_elems[0x13] = 0;
  result_34.m_backend.data._M_elems[0x14] = 0;
  result_34.m_backend.data._M_elems[0x15] = 0;
  result_34.m_backend.data._M_elems[0x16] = 0;
  result_34.m_backend.data._M_elems[0x17] = 0;
  result_34.m_backend.data._M_elems[0x18] = 0;
  result_34.m_backend.data._M_elems[0x19] = 0;
  result_34.m_backend.data._M_elems._104_5_ = 0;
  result_34.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_34.m_backend.exp = 0;
  result_34.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_34.m_backend,&local_1cb8,&local_1738);
  result_35.m_backend.fpclass = cpp_dec_float_finite;
  result_35.m_backend.prec_elem = 0x1c;
  result_35.m_backend.data._M_elems[0] = 0;
  result_35.m_backend.data._M_elems[1] = 0;
  result_35.m_backend.data._M_elems[2] = 0;
  result_35.m_backend.data._M_elems[3] = 0;
  result_35.m_backend.data._M_elems[4] = 0;
  result_35.m_backend.data._M_elems[5] = 0;
  result_35.m_backend.data._M_elems[6] = 0;
  result_35.m_backend.data._M_elems[7] = 0;
  result_35.m_backend.data._M_elems[8] = 0;
  result_35.m_backend.data._M_elems[9] = 0;
  result_35.m_backend.data._M_elems[10] = 0;
  result_35.m_backend.data._M_elems[0xb] = 0;
  result_35.m_backend.data._M_elems[0xc] = 0;
  result_35.m_backend.data._M_elems[0xd] = 0;
  result_35.m_backend.data._M_elems[0xe] = 0;
  result_35.m_backend.data._M_elems[0xf] = 0;
  result_35.m_backend.data._M_elems[0x10] = 0;
  result_35.m_backend.data._M_elems[0x11] = 0;
  result_35.m_backend.data._M_elems[0x12] = 0;
  result_35.m_backend.data._M_elems[0x13] = 0;
  result_35.m_backend.data._M_elems[0x14] = 0;
  result_35.m_backend.data._M_elems[0x15] = 0;
  result_35.m_backend.data._M_elems[0x16] = 0;
  result_35.m_backend.data._M_elems[0x17] = 0;
  result_35.m_backend.data._M_elems[0x18] = 0;
  result_35.m_backend.data._M_elems[0x19] = 0;
  result_35.m_backend.data._M_elems._104_5_ = 0;
  result_35.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_35.m_backend.exp = 0;
  result_35.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_35.m_backend,&result_34.m_backend,&scale1.m_backend);
  z1.m_backend.fpclass = cpp_dec_float_finite;
  z1.m_backend.prec_elem = 0x1c;
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0;
  z1.m_backend.data._M_elems[2] = 0;
  z1.m_backend.data._M_elems[3] = 0;
  z1.m_backend.data._M_elems[4] = 0;
  z1.m_backend.data._M_elems[5] = 0;
  z1.m_backend.data._M_elems[6] = 0;
  z1.m_backend.data._M_elems[7] = 0;
  z1.m_backend.data._M_elems[8] = 0;
  z1.m_backend.data._M_elems[9] = 0;
  z1.m_backend.data._M_elems[10] = 0;
  z1.m_backend.data._M_elems[0xb] = 0;
  z1.m_backend.data._M_elems[0xc] = 0;
  z1.m_backend.data._M_elems[0xd] = 0;
  z1.m_backend.data._M_elems[0xe] = 0;
  z1.m_backend.data._M_elems[0xf] = 0;
  z1.m_backend.data._M_elems[0x10] = 0;
  z1.m_backend.data._M_elems[0x11] = 0;
  z1.m_backend.data._M_elems[0x12] = 0;
  z1.m_backend.data._M_elems[0x13] = 0;
  z1.m_backend.data._M_elems[0x14] = 0;
  z1.m_backend.data._M_elems[0x15] = 0;
  z1.m_backend.data._M_elems[0x16] = 0;
  z1.m_backend.data._M_elems[0x17] = 0;
  z1.m_backend.data._M_elems[0x18] = 0;
  z1.m_backend.data._M_elems[0x19] = 0;
  z1.m_backend.data._M_elems._104_5_ = 0;
  z1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  z1.m_backend.exp = 0;
  z1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&z1.m_backend,&z2.m_backend,&result_35.m_backend);
  result_35.m_backend.fpclass = cpp_dec_float_finite;
  result_35.m_backend.prec_elem = 0x1c;
  result_35.m_backend.data._M_elems[0] = 0;
  result_35.m_backend.data._M_elems[1] = 0;
  result_35.m_backend.data._M_elems[2] = 0;
  result_35.m_backend.data._M_elems[3] = 0;
  result_35.m_backend.data._M_elems[4] = 0;
  result_35.m_backend.data._M_elems[5] = 0;
  result_35.m_backend.data._M_elems[6] = 0;
  result_35.m_backend.data._M_elems[7] = 0;
  result_35.m_backend.data._M_elems[8] = 0;
  result_35.m_backend.data._M_elems[9] = 0;
  result_35.m_backend.data._M_elems[10] = 0;
  result_35.m_backend.data._M_elems[0xb] = 0;
  result_35.m_backend.data._M_elems[0xc] = 0;
  result_35.m_backend.data._M_elems[0xd] = 0;
  result_35.m_backend.data._M_elems[0xe] = 0;
  result_35.m_backend.data._M_elems[0xf] = 0;
  result_35.m_backend.data._M_elems[0x10] = 0;
  result_35.m_backend.data._M_elems[0x11] = 0;
  result_35.m_backend.data._M_elems[0x12] = 0;
  result_35.m_backend.data._M_elems[0x13] = 0;
  result_35.m_backend.data._M_elems[0x14] = 0;
  result_35.m_backend.data._M_elems[0x15] = 0;
  result_35.m_backend.data._M_elems[0x16] = 0;
  result_35.m_backend.data._M_elems[0x17] = 0;
  result_35.m_backend.data._M_elems[0x18] = 0;
  result_35.m_backend.data._M_elems[0x19] = 0;
  result_35.m_backend.data._M_elems._104_5_ = 0;
  result_35.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_35.m_backend.exp = 0;
  result_35.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_35.m_backend,&local_18b8,&scale2.m_backend);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1cb8,&local_16b8);
  result_34.m_backend.fpclass = cpp_dec_float_finite;
  result_34.m_backend.prec_elem = 0x1c;
  result_34.m_backend.data._M_elems[0] = 0;
  result_34.m_backend.data._M_elems[1] = 0;
  result_34.m_backend.data._M_elems[2] = 0;
  result_34.m_backend.data._M_elems[3] = 0;
  result_34.m_backend.data._M_elems[4] = 0;
  result_34.m_backend.data._M_elems[5] = 0;
  result_34.m_backend.data._M_elems[6] = 0;
  result_34.m_backend.data._M_elems[7] = 0;
  result_34.m_backend.data._M_elems[8] = 0;
  result_34.m_backend.data._M_elems[9] = 0;
  result_34.m_backend.data._M_elems[10] = 0;
  result_34.m_backend.data._M_elems[0xb] = 0;
  result_34.m_backend.data._M_elems[0xc] = 0;
  result_34.m_backend.data._M_elems[0xd] = 0;
  result_34.m_backend.data._M_elems[0xe] = 0;
  result_34.m_backend.data._M_elems[0xf] = 0;
  result_34.m_backend.data._M_elems[0x10] = 0;
  result_34.m_backend.data._M_elems[0x11] = 0;
  result_34.m_backend.data._M_elems[0x12] = 0;
  result_34.m_backend.data._M_elems[0x13] = 0;
  result_34.m_backend.data._M_elems[0x14] = 0;
  result_34.m_backend.data._M_elems[0x15] = 0;
  result_34.m_backend.data._M_elems[0x16] = 0;
  result_34.m_backend.data._M_elems[0x17] = 0;
  result_34.m_backend.data._M_elems[0x18] = 0;
  result_34.m_backend.data._M_elems[0x19] = 0;
  result_34.m_backend.data._M_elems._104_5_ = 0;
  result_34.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_34.m_backend.exp = 0;
  result_34.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_34.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr,&scale2.m_backend);
  z2.m_backend.fpclass = cpp_dec_float_finite;
  z2.m_backend.prec_elem = 0x1c;
  z2.m_backend.data._M_elems[0] = 0;
  z2.m_backend.data._M_elems[1] = 0;
  z2.m_backend.data._M_elems[2] = 0;
  z2.m_backend.data._M_elems[3] = 0;
  z2.m_backend.data._M_elems[4] = 0;
  z2.m_backend.data._M_elems[5] = 0;
  z2.m_backend.data._M_elems[6] = 0;
  z2.m_backend.data._M_elems[7] = 0;
  z2.m_backend.data._M_elems[8] = 0;
  z2.m_backend.data._M_elems[9] = 0;
  z2.m_backend.data._M_elems[10] = 0;
  z2.m_backend.data._M_elems[0xb] = 0;
  z2.m_backend.data._M_elems[0xc] = 0;
  z2.m_backend.data._M_elems[0xd] = 0;
  z2.m_backend.data._M_elems[0xe] = 0;
  z2.m_backend.data._M_elems[0xf] = 0;
  z2.m_backend.data._M_elems[0x10] = 0;
  z2.m_backend.data._M_elems[0x11] = 0;
  z2.m_backend.data._M_elems[0x12] = 0;
  z2.m_backend.data._M_elems[0x13] = 0;
  z2.m_backend.data._M_elems[0x14] = 0;
  z2.m_backend.data._M_elems[0x15] = 0;
  z2.m_backend.data._M_elems[0x16] = 0;
  z2.m_backend.data._M_elems[0x17] = 0;
  z2.m_backend.data._M_elems[0x18] = 0;
  z2.m_backend.data._M_elems[0x19] = 0;
  z2.m_backend.data._M_elems._104_5_ = 0;
  z2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  z2.m_backend.exp = 0;
  z2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&z2.m_backend,&result_35.m_backend,&result_34.m_backend);
  pcVar27 = &z1.m_backend;
  pnVar26 = &local_7b0;
  for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar39 * -8 + 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_7b0.m_backend.exp = z1.m_backend.exp;
  local_7b0.m_backend.neg = z1.m_backend.neg;
  local_7b0.m_backend.fpclass = z1.m_backend.fpclass;
  local_7b0.m_backend.prec_elem = z1.m_backend.prec_elem;
  pSVar48 = this_01;
  epsZero(&local_830,this_01);
  bVar14 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_7b0,&local_830);
  if (bVar14) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&z1,0.0);
  }
  pnVar26 = &z2;
  pnVar25 = &local_8b0;
  for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_8b0.m_backend.exp = z2.m_backend.exp;
  local_8b0.m_backend.neg = z2.m_backend.neg;
  local_8b0.m_backend.fpclass = z2.m_backend.fpclass;
  local_8b0.m_backend.prec_elem = z2.m_backend.prec_elem;
  epsZero(&local_930,this_01);
  bVar14 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_8b0,&local_930);
  if (bVar14) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&z2,0.0);
  }
  result_35.m_backend.fpclass = cpp_dec_float_finite;
  result_35.m_backend.prec_elem = 0x1c;
  result_35.m_backend.data._M_elems[0] = 0;
  result_35.m_backend.data._M_elems[1] = 0;
  result_35.m_backend.data._M_elems[2] = 0;
  result_35.m_backend.data._M_elems[3] = 0;
  result_35.m_backend.data._M_elems[4] = 0;
  result_35.m_backend.data._M_elems[5] = 0;
  result_35.m_backend.data._M_elems[6] = 0;
  result_35.m_backend.data._M_elems[7] = 0;
  result_35.m_backend.data._M_elems[8] = 0;
  result_35.m_backend.data._M_elems[9] = 0;
  result_35.m_backend.data._M_elems[10] = 0;
  result_35.m_backend.data._M_elems[0xb] = 0;
  result_35.m_backend.data._M_elems[0xc] = 0;
  result_35.m_backend.data._M_elems[0xd] = 0;
  result_35.m_backend.data._M_elems[0xe] = 0;
  result_35.m_backend.data._M_elems[0xf] = 0;
  result_35.m_backend.data._M_elems[0x10] = 0;
  result_35.m_backend.data._M_elems[0x11] = 0;
  result_35.m_backend.data._M_elems[0x12] = 0;
  result_35.m_backend.data._M_elems[0x13] = 0;
  result_35.m_backend.data._M_elems[0x14] = 0;
  result_35.m_backend.data._M_elems[0x15] = 0;
  result_35.m_backend.data._M_elems[0x16] = 0;
  result_35.m_backend.data._M_elems[0x17] = 0;
  result_35.m_backend.data._M_elems[0x18] = 0;
  result_35.m_backend.data._M_elems[0x19] = 0;
  result_35.m_backend.data._M_elems._104_5_ = 0;
  result_35.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_35.m_backend.exp = 0;
  result_35.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_35.m_backend,&local_1d38,&local_1cb8);
  result_34.m_backend.data._M_elems[0] = 0;
  result_34.m_backend.data._M_elems[1] = 0;
  tVar15 = boost::multiprecision::operator>
                     ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result_35.m_backend,(double *)&result_34);
  if (tVar15) {
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_34.m_backend,*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1738,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_34.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_35.m_backend,-*pdVar17,(type *)0x0);
    }
    else {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&z1.m_backend,&scale1.m_backend);
      result_35.m_backend.fpclass = cpp_dec_float_finite;
      result_35.m_backend.prec_elem = 0x1c;
      result_35.m_backend.data._M_elems[0] = 0;
      result_35.m_backend.data._M_elems[1] = 0;
      result_35.m_backend.data._M_elems[2] = 0;
      result_35.m_backend.data._M_elems[3] = 0;
      result_35.m_backend.data._M_elems[4] = 0;
      result_35.m_backend.data._M_elems[5] = 0;
      result_35.m_backend.data._M_elems[6] = 0;
      result_35.m_backend.data._M_elems[7] = 0;
      result_35.m_backend.data._M_elems[8] = 0;
      result_35.m_backend.data._M_elems[9] = 0;
      result_35.m_backend.data._M_elems[10] = 0;
      result_35.m_backend.data._M_elems[0xb] = 0;
      result_35.m_backend.data._M_elems[0xc] = 0;
      result_35.m_backend.data._M_elems[0xd] = 0;
      result_35.m_backend.data._M_elems[0xe] = 0;
      result_35.m_backend.data._M_elems[0xf] = 0;
      result_35.m_backend.data._M_elems[0x10] = 0;
      result_35.m_backend.data._M_elems[0x11] = 0;
      result_35.m_backend.data._M_elems[0x12] = 0;
      result_35.m_backend.data._M_elems[0x13] = 0;
      result_35.m_backend.data._M_elems[0x14] = 0;
      result_35.m_backend.data._M_elems[0x15] = 0;
      result_35.m_backend.data._M_elems[0x16] = 0;
      result_35.m_backend.data._M_elems[0x17] = 0;
      result_35.m_backend.data._M_elems[0x18] = 0;
      result_35.m_backend.data._M_elems[0x19] = 0;
      result_35.m_backend.data._M_elems._104_5_ = 0;
      result_35.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_35.m_backend.exp = 0;
      result_35.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_35.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr,&local_1d38);
    }
    pnVar26 = &result_35;
    pnVar25 = &local_1ab8;
    for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1ab8.m_backend.exp = result_35.m_backend.exp;
    local_1ab8.m_backend.neg = result_35.m_backend.neg;
    local_1ab8.m_backend.fpclass = result_35.m_backend.fpclass;
    local_1ab8.m_backend.prec_elem = result_35.m_backend.prec_elem;
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_34.m_backend,-*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_16b8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_34.m_backend);
    uVar55 = (undefined4)((ulong)pIVar54 >> 0x20);
    uVar52 = (undefined4)((ulong)pIVar51 >> 0x20);
    if (!tVar15) {
      pcVar27 = &z2.m_backend;
      pcVar28 = &scale2.m_backend;
LAB_00418fda:
      uVar55 = (undefined4)((ulong)pIVar54 >> 0x20);
      uVar52 = (undefined4)((ulong)pIVar51 >> 0x20);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,pcVar27,pcVar28);
      result_35.m_backend.fpclass = cpp_dec_float_finite;
      result_35.m_backend.prec_elem = 0x1c;
      result_35.m_backend.data._M_elems[0] = 0;
      result_35.m_backend.data._M_elems[1] = 0;
      result_35.m_backend.data._M_elems[2] = 0;
      result_35.m_backend.data._M_elems[3] = 0;
      result_35.m_backend.data._M_elems[4] = 0;
      result_35.m_backend.data._M_elems[5] = 0;
      result_35.m_backend.data._M_elems[6] = 0;
      result_35.m_backend.data._M_elems[7] = 0;
      result_35.m_backend.data._M_elems[8] = 0;
      result_35.m_backend.data._M_elems[9] = 0;
      result_35.m_backend.data._M_elems[10] = 0;
      result_35.m_backend.data._M_elems[0xb] = 0;
      result_35.m_backend.data._M_elems[0xc] = 0;
      result_35.m_backend.data._M_elems[0xd] = 0;
      result_35.m_backend.data._M_elems[0xe] = 0;
      result_35.m_backend.data._M_elems[0xf] = 0;
      result_35.m_backend.data._M_elems[0x10] = 0;
      result_35.m_backend.data._M_elems[0x11] = 0;
      result_35.m_backend.data._M_elems[0x12] = 0;
      result_35.m_backend.data._M_elems[0x13] = 0;
      result_35.m_backend.data._M_elems[0x14] = 0;
      result_35.m_backend.data._M_elems[0x15] = 0;
      result_35.m_backend.data._M_elems[0x16] = 0;
      result_35.m_backend.data._M_elems[0x17] = 0;
      result_35.m_backend.data._M_elems[0x18] = 0;
      result_35.m_backend.data._M_elems[0x19] = 0;
      result_35.m_backend.data._M_elems._104_5_ = 0;
      result_35.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_35.m_backend.exp = 0;
      result_35.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_35.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr,&local_1d38);
      goto LAB_00419021;
    }
  }
  else {
    result_35.m_backend.fpclass = cpp_dec_float_finite;
    result_35.m_backend.prec_elem = 0x1c;
    result_35.m_backend.data._M_elems[0] = 0;
    result_35.m_backend.data._M_elems[1] = 0;
    result_35.m_backend.data._M_elems[2] = 0;
    result_35.m_backend.data._M_elems[3] = 0;
    result_35.m_backend.data._M_elems[4] = 0;
    result_35.m_backend.data._M_elems[5] = 0;
    result_35.m_backend.data._M_elems[6] = 0;
    result_35.m_backend.data._M_elems[7] = 0;
    result_35.m_backend.data._M_elems[8] = 0;
    result_35.m_backend.data._M_elems[9] = 0;
    result_35.m_backend.data._M_elems[10] = 0;
    result_35.m_backend.data._M_elems[0xb] = 0;
    result_35.m_backend.data._M_elems[0xc] = 0;
    result_35.m_backend.data._M_elems[0xd] = 0;
    result_35.m_backend.data._M_elems[0xe] = 0;
    result_35.m_backend.data._M_elems[0xf] = 0;
    result_35.m_backend.data._M_elems[0x10] = 0;
    result_35.m_backend.data._M_elems[0x11] = 0;
    result_35.m_backend.data._M_elems[0x12] = 0;
    result_35.m_backend.data._M_elems[0x13] = 0;
    result_35.m_backend.data._M_elems[0x14] = 0;
    result_35.m_backend.data._M_elems[0x15] = 0;
    result_35.m_backend.data._M_elems[0x16] = 0;
    result_35.m_backend.data._M_elems[0x17] = 0;
    result_35.m_backend.data._M_elems[0x18] = 0;
    result_35.m_backend.data._M_elems[0x19] = 0;
    result_35.m_backend.data._M_elems._104_5_ = 0;
    result_35.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_35.m_backend.exp = 0;
    result_35.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_35.m_backend,&local_1d38,&local_1cb8);
    result_34.m_backend.data._M_elems[0] = 0;
    result_34.m_backend.data._M_elems[1] = 0;
    tVar15 = boost::multiprecision::operator<
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_35.m_backend,(double *)&result_34);
    if (!tVar15) {
      pSVar20 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result_35,"XMAISM12 This should never happen.",(allocator *)&result_34);
      SPxInternalCodeException::SPxInternalCodeException(pSVar20,(string *)&result_35);
      __cxa_throw(pSVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_34.m_backend,-*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_16b8,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_34.m_backend);
    if (tVar15) {
      pdVar17 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_35.m_backend,-*pdVar17,(type *)0x0);
    }
    else {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&z2.m_backend,&scale2.m_backend);
      result_35.m_backend.fpclass = cpp_dec_float_finite;
      result_35.m_backend.prec_elem = 0x1c;
      result_35.m_backend.data._M_elems[0] = 0;
      result_35.m_backend.data._M_elems[1] = 0;
      result_35.m_backend.data._M_elems[2] = 0;
      result_35.m_backend.data._M_elems[3] = 0;
      result_35.m_backend.data._M_elems[4] = 0;
      result_35.m_backend.data._M_elems[5] = 0;
      result_35.m_backend.data._M_elems[6] = 0;
      result_35.m_backend.data._M_elems[7] = 0;
      result_35.m_backend.data._M_elems[8] = 0;
      result_35.m_backend.data._M_elems[9] = 0;
      result_35.m_backend.data._M_elems[10] = 0;
      result_35.m_backend.data._M_elems[0xb] = 0;
      result_35.m_backend.data._M_elems[0xc] = 0;
      result_35.m_backend.data._M_elems[0xd] = 0;
      result_35.m_backend.data._M_elems[0xe] = 0;
      result_35.m_backend.data._M_elems[0xf] = 0;
      result_35.m_backend.data._M_elems[0x10] = 0;
      result_35.m_backend.data._M_elems[0x11] = 0;
      result_35.m_backend.data._M_elems[0x12] = 0;
      result_35.m_backend.data._M_elems[0x13] = 0;
      result_35.m_backend.data._M_elems[0x14] = 0;
      result_35.m_backend.data._M_elems[0x15] = 0;
      result_35.m_backend.data._M_elems[0x16] = 0;
      result_35.m_backend.data._M_elems[0x17] = 0;
      result_35.m_backend.data._M_elems[0x18] = 0;
      result_35.m_backend.data._M_elems[0x19] = 0;
      result_35.m_backend.data._M_elems._104_5_ = 0;
      result_35.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_35.m_backend.exp = 0;
      result_35.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_35.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr,&local_1d38);
    }
    pnVar26 = &result_35;
    pnVar25 = &local_1ab8;
    for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1ab8.m_backend.exp = result_35.m_backend.exp;
    local_1ab8.m_backend.neg = result_35.m_backend.neg;
    local_1ab8.m_backend.fpclass = result_35.m_backend.fpclass;
    local_1ab8.m_backend.prec_elem = result_35.m_backend.prec_elem;
    pdVar17 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_34.m_backend,*pdVar17,(type *)0x0);
    tVar15 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1738,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_34.m_backend);
    uVar55 = (undefined4)((ulong)pIVar54 >> 0x20);
    uVar52 = (undefined4)((ulong)pIVar51 >> 0x20);
    if (!tVar15) {
      pcVar27 = &z1.m_backend;
      pcVar28 = &scale1.m_backend;
      goto LAB_00418fda;
    }
  }
  pdVar17 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&result_35.m_backend,*pdVar17,(type *)0x0);
LAB_00419021:
  pnVar26 = &result_35;
  pnVar25 = &local_1b38;
  for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_1b38.m_backend.exp = result_35.m_backend.exp;
  local_1b38.m_backend.neg = result_35.m_backend.neg;
  local_1b38.m_backend.fpclass = result_35.m_backend.fpclass;
  local_1b38.m_backend.prec_elem = result_35.m_backend.prec_elem;
  lVar35 = 0x1c;
  pcVar27 = &local_1638;
  pnVar26 = &result_35;
  for (lVar37 = lVar35; bVar14 = local_1638.neg, iVar49 = local_1638.exp, lVar37 != 0;
      lVar37 = lVar37 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  fVar53 = local_1638.fpclass;
  iVar50 = local_1638.prec_elem;
  pcVar27 = &local_17b8;
  pnVar26 = &result_34;
  for (lVar37 = lVar35; uVar8 = local_17b8._120_8_, iVar4 = local_17b8.exp, lVar37 != 0;
      lVar37 = lVar37 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  pnVar26 = &local_1ab8;
  pnVar25 = &local_9b0;
  for (lVar37 = lVar35; lVar37 != 0; lVar37 = lVar37 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_9b0.m_backend.exp = local_1ab8.m_backend.exp;
  local_9b0.m_backend.neg = local_1ab8.m_backend.neg;
  local_9b0.m_backend.fpclass = local_1ab8.m_backend.fpclass;
  local_9b0.m_backend.prec_elem = local_1ab8.m_backend.prec_elem;
  pcVar27 = &local_1638;
  pnVar26 = &local_a30;
  for (; lVar35 != 0; lVar35 = lVar35 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_a30.m_backend.exp = iVar49;
  uVar47 = CONCAT31((int3)((uint)iVar46 >> 8),bVar14);
  local_a30.m_backend.neg = bVar14;
  local_a30.m_backend.fpclass = fVar53;
  local_a30.m_backend.prec_elem = iVar50;
  uVar41 = local_17b8.neg;
  epsZero(&local_ab0,this_01);
  bVar14 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_9b0,&local_a30,&local_ab0);
  if (bVar14) {
    (*(lp_00->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp_00,(ulong)uVar43,&local_1ab8,0);
    piVar1 = &(this_01->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_chgBnds;
    *piVar1 = *piVar1 + 1;
  }
  lVar35 = 0x1c;
  pnVar26 = &local_1b38;
  pnVar25 = &local_b30;
  for (lVar37 = lVar35; lVar37 != 0; lVar37 = lVar37 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_b30.m_backend.exp = local_1b38.m_backend.exp;
  local_b30.m_backend.neg = local_1b38.m_backend.neg;
  local_b30.m_backend.fpclass = local_1b38.m_backend.fpclass;
  local_b30.m_backend.prec_elem = local_1b38.m_backend.prec_elem;
  pcVar27 = &local_17b8;
  pnVar26 = &local_bb0;
  for (; lVar35 != 0; lVar35 = lVar35 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_bb0.m_backend.exp = local_17b8.exp;
  local_bb0.m_backend.neg = local_17b8.neg;
  local_bb0.m_backend.fpclass = local_17b8.fpclass;
  local_bb0.m_backend.prec_elem = local_17b8.prec_elem;
  epsZero(&local_c30,this_01);
  bVar14 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_b30,&local_bb0,&local_c30);
  if (bVar14) {
    (*(lp_00->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(lp_00,(ulong)uVar43,&local_1b38,0);
    piVar1 = &(this_01->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_chgBnds;
    *piVar1 = *piVar1 + 1;
  }
  this_00 = (AggregationPS *)operator_new(0x378);
  uVar9 = local_17b8._120_8_;
  uVar42 = *i;
  lVar35 = 0x1c;
  pcVar27 = &local_18b8;
  pnVar26 = &local_cb0;
  for (lVar37 = lVar35; lVar37 != 0; lVar37 = lVar37 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar27->data)._M_elems[0];
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_cb0.m_backend.exp = local_18b8.exp;
  local_cb0.m_backend.neg = local_18b8.neg;
  local_cb0.m_backend.fpclass = local_18b8.fpclass;
  local_cb0.m_backend.prec_elem = local_18b8.prec_elem;
  pnVar26 = &result_34;
  pnVar25 = &local_d30;
  for (lVar37 = lVar35; lVar37 != 0; lVar37 = lVar37 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_d30.m_backend.exp = iVar4;
  local_d30.m_backend.neg = (bool)uVar41;
  local_17b8.fpclass = (fpclass_type)uVar8;
  local_17b8.prec_elem = SUB84(uVar8,4);
  local_d30.m_backend.fpclass = local_17b8.fpclass;
  local_d30.m_backend.prec_elem = local_17b8.prec_elem;
  pnVar26 = &result_35;
  puVar30 = local_db0;
  for (; lVar35 != 0; lVar35 = lVar35 + -1) {
    *puVar30 = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    puVar30 = puVar30 + (ulong)bVar39 * -2 + 1;
  }
  local_d40 = iVar49;
  local_d3c = (undefined1)uVar47;
  local_17b8._120_8_ = uVar9;
  local_d38 = fVar53;
  local_d34 = iVar50;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1dc8,
             &(this_01->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  oldlower.m_backend.data._M_elems._8_8_ = &local_1dc8;
  oldlower.m_backend.data._M_elems._0_8_ = local_db0;
  oldlower.m_backend.data._M_elems._16_15_ = in_stack_ffffffffffffdfb8;
  oldlower.m_backend.data._M_elems[7]._3_1_ = uVar41;
  oldlower.m_backend.data._M_elems[8] = i_00;
  oldlower.m_backend.data._M_elems[9] = uVar42;
  oldlower.m_backend.data._M_elems._40_8_ = lp_00;
  oldlower.m_backend.data._M_elems[0xc] = uVar44;
  oldlower.m_backend.data._M_elems[0xd] = uVar45;
  oldlower.m_backend.data._M_elems[0xe] = uVar47;
  oldlower.m_backend.data._M_elems[0xf] = in_stack_ffffffffffffdfe4;
  oldlower.m_backend.data._M_elems._64_8_ = pSVar48;
  oldlower.m_backend.data._M_elems[0x12] = (int)lVar22;
  oldlower.m_backend.data._M_elems[0x13] = (int)((ulong)lVar22 >> 0x20);
  oldlower.m_backend.data._M_elems[0x14] = (int)lVar21;
  oldlower.m_backend.data._M_elems[0x15] = (int)((ulong)lVar21 >> 0x20);
  oldlower.m_backend.data._M_elems[0x16] = iVar50;
  oldlower.m_backend.data._M_elems[0x17] = uVar52;
  oldlower.m_backend.data._M_elems[0x18] = fVar53;
  oldlower.m_backend.data._M_elems[0x19] = uVar55;
  oldlower.m_backend.data._M_elems._104_8_ = i;
  oldlower.m_backend.exp = iVar56;
  oldlower.m_backend._116_4_ = fVar57;
  oldlower.m_backend.fpclass = iVar58;
  oldlower.m_backend.prec_elem = iVar59;
  tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       result.m_backend.data._M_elems[1];
  tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       result.m_backend.data._M_elems[0];
  tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result.m_backend.data._M_elems._8_8_;
  AggregationPS::AggregationPS(this_00,lp_00,uVar42,i_00,&local_cb0,&local_d30,oldlower,tols);
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::AggregationPS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)&ptr,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1dc8._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(pSVar48->m_hist).data,&ptr);
  removeRow(pSVar48,lp_00,*i);
  removeCol(pSVar48,lp_00,i_00);
  uVar2 = (pSVar48->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remRows;
  uVar3 = (pSVar48->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols;
  (pSVar48->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = uVar2 + 1;
  (pSVar48->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = uVar3 + 1;
  piVar1 = &(pSVar48->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remNzos;
  *piVar1 = *piVar1 + 2;
  piVar1 = (pSVar48->m_stat).data + 0xf;
  *piVar1 = *piVar1 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}